

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined3 uVar6;
  int *piVar7;
  bool reduce_c;
  int i_12;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 in_RAX;
  ulong uVar12;
  undefined4 uVar13;
  byte bVar14;
  byte bVar15;
  Mat *pMVar16;
  void *pvVar17;
  Mat *pMVar18;
  ulong uVar19;
  uint *puVar20;
  Mat *pMVar21;
  Mat *pMVar22;
  Mat *pMVar23;
  long lVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  undefined1 post_process;
  bool post_process_00;
  byte bVar28;
  Mat *pMVar29;
  void *pvVar30;
  void *pvVar31;
  Mat *pMVar32;
  float extraout_XMM0_Da;
  float fVar33;
  float extraout_XMM0_Da_00;
  float fVar34;
  undefined1 in_XMM0 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_var [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 extraout_XMM0_19 [16];
  undefined1 extraout_XMM0_20 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 extraout_XMM0_21 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 extraout_XMM0_23 [16];
  undefined1 extraout_XMM0_24 [16];
  undefined1 extraout_var_03 [12];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_var_04 [12];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  int iVar201;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  Option *in_stack_ffffffffffffff10;
  Mat *local_e8;
  void *local_c8;
  Mat *local_c0;
  Mat mins;
  void *local_58;
  int axes_flag [3];
  
  uVar11 = bottom_blob->dims;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  if (this->reduce_all == 0) {
    iVar8 = (this->axes).w;
    if (0 < (long)iVar8) {
      pvVar17 = (this->axes).data;
      lVar27 = 0;
      do {
        iVar201 = *(int *)((long)pvVar17 + lVar27 * 4);
        axes_flag[(int)(iVar201 + (iVar201 >> 0x1f & uVar11 + 1) + -1)] = 1;
        lVar27 = lVar27 + 1;
      } while (iVar8 != lVar27);
    }
    auVar106 = _DAT_003136b0;
    if (uVar11 != 1) {
      if (uVar11 == 2) {
        in_XMM0._4_4_ = axes_flag[1];
        in_XMM0._0_4_ = (float)axes_flag[0];
        in_XMM0._8_8_ = 0;
        auVar106._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar106._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar106._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar106._12_4_ = 0xffffffff;
      }
      else {
        if (uVar11 == 3) {
          uVar13 = (undefined4)CONCAT71((int7)(int3)((uint)iVar8 >> 8),axes_flag[0] == 1);
          in_XMM0._4_4_ = axes_flag[2];
          in_XMM0._0_4_ = (float)axes_flag[1];
          in_XMM0._8_8_ = 0;
          auVar106._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar106._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar106._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar106._12_4_ = 0xffffffff;
          goto LAB_001f8bfe;
        }
        auVar106 = (undefined1  [16])0x0;
      }
    }
    uVar13 = 0;
  }
  else {
    uVar13 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    auVar106 = _DAT_003140f0;
  }
LAB_001f8bfe:
  puVar20 = &switchD_001f8c1c::switchdataD_00316b20;
  lVar27 = auVar106._0_8_;
  lVar24 = auVar106._8_8_;
  reduce_c = SUB41(uVar13,0);
  fVar33 = in_XMM0._0_4_;
  bVar14 = auVar106[0];
  bVar15 = auVar106[8];
  uVar6 = auVar106._1_3_;
  switch(this->operation) {
  case 0:
    fVar33 = this->coeff;
    iVar8 = this->keepdims;
    auVar107._0_8_ = lVar27 << 0x3f;
    auVar107._8_8_ = lVar24 << 0x3f;
    uVar13 = movmskpd(uVar11,auVar107);
    bVar15 = (byte)uVar13;
    post_process_00 = false;
    goto LAB_001f933f;
  case 1:
    fVar33 = this->coeff;
    post_process = (undefined1)this->keepdims;
    auVar111._0_8_ = lVar27 << 0x3f;
    auVar111._8_8_ = lVar24 << 0x3f;
    uVar13 = movmskpd(uVar11,auVar111);
    bVar15 = (byte)uVar13;
    goto LAB_001f8dda;
  case 2:
    fVar33 = this->coeff;
    if (this->keepdims == 0) {
      auVar114._0_8_ = lVar27 << 0x3f;
      auVar114._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar114);
      puVar20 = (uint *)top_blob;
      iVar8 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    else {
      auVar109._0_8_ = lVar27 << 0x3f;
      auVar109._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar109);
      puVar20 = (uint *)top_blob;
      iVar8 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
joined_r0x002005a8:
    if (iVar8 != 0) {
      return -100;
    }
    break;
  case 3:
    if (uVar11 == 3) {
      auVar36._0_8_ = lVar27 << 0x3f;
      auVar36._8_8_ = lVar24 << 0x3f;
      uVar10 = movmskpd(0x316b20,auVar36);
      iVar8 = 1;
      uVar11 = 1;
      if ((uVar10 & 2) != 0) {
        uVar11 = bottom_blob->w;
      }
      if ((uVar10 & 1) != 0) {
        iVar8 = bottom_blob->h;
      }
      iVar8 = iVar8 * uVar11;
      if (reduce_c != false) {
        iVar8 = iVar8 * bottom_blob->c;
      }
    }
    else if (uVar11 == 2) {
      auVar35._0_8_ = lVar27 << 0x3f;
      auVar35._8_8_ = lVar24 << 0x3f;
      uVar11 = movmskpd(2,auVar35);
      iVar8 = 1;
      if ((uVar11 & 2) != 0) {
        iVar8 = bottom_blob->w;
      }
      if ((uVar11 & 1) != 0) {
        iVar8 = iVar8 * bottom_blob->h;
      }
    }
    else {
      iVar8 = 1;
      if (uVar11 == 1) {
        iVar8 = bottom_blob->w;
      }
    }
    fVar33 = this->coeff / (float)iVar8;
    iVar8 = this->keepdims;
    auVar116._0_8_ = lVar27 << 0x3f;
    auVar116._8_8_ = lVar24 << 0x3f;
    uVar13 = movmskpd(uVar11,auVar116);
    bVar15 = (byte)uVar13;
    post_process_00 = true;
LAB_001f933f:
    iVar8 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar33,(bool)(bVar15 >> 1),(bool)(bVar15 & 1),reduce_c,
                       post_process_00,0.0,iVar8,opt);
    return iVar8;
  case 4:
    fVar33 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar11 == 3) {
        uVar11 = bottom_blob->w;
        lVar27 = (long)(int)uVar11;
        uVar10 = bottom_blob->h;
        uVar19 = (ulong)uVar10;
        uVar9 = bottom_blob->c;
        pMVar22 = (Mat *)(ulong)uVar9;
        uVar26 = uVar10 * uVar11;
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar60._0_8_ = SUB168(auVar59 ^ auVar106,0) << 0x3f;
        auVar60._8_8_ = SUB168(auVar59 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(3,auVar60);
        bVar28 = reduce_c ^ 1;
        puVar20 = (uint *)pMVar22;
        if (iVar8 == 0 && bVar28 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar9 < 1) {
              fVar34 = -3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar17 = bottom_blob->data;
              puVar20 = (uint *)(ulong)uVar26;
              pMVar21 = (Mat *)0x0;
              do {
                fVar34 = -3.4028235e+38;
                if (0 < (int)uVar26) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    if (fVar34 <= fVar1) {
                      fVar34 = fVar1;
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while ((Mat *)puVar20 != pMVar29);
                }
                *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              } while (pMVar21 != pMVar22);
              fVar34 = -3.4028235e+38;
              pMVar21 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
                if (fVar34 <= fVar1) {
                  fVar34 = fVar1;
                }
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001fee6a;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto LAB_001ffe6e;
        }
        if (iVar8 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)(ulong)uVar26;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = -3.4028235e+38;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar34 <= fVar1) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)puVar20 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar21 != pMVar22);
          }
        }
        else {
          pMVar21 = (Mat *)(ulong)uVar11;
          bVar25 = (byte)iVar8 >> 1 | bVar14;
          if (reduce_c != false || (bVar25 & 1) != 0) {
            if ((bVar25 & 1) == 0 && bVar28 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)0x1;
              Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar82._8_4_ = (int)lVar24;
                  auVar82._0_8_ = lVar24;
                  auVar82._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar82 = auVar82 ^ _DAT_003130e0;
                  do {
                    auVar165._8_4_ = (int)puVar20;
                    auVar165._0_8_ = puVar20;
                    auVar165._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar165 | auVar68) ^ auVar106;
                    iVar8 = auVar82._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar82._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != auVar82._12_4_ || auVar204._8_4_ <= auVar82._8_4_) &&
                        auVar204._12_4_ <= auVar82._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar165 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar82._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0xff7fffff;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      pvVar30 = pvVar17;
                      do {
                        auVar126 = ZEXT816(0xff7fffff);
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          auVar126 = ZEXT816(0xff7fffff);
                          do {
                            fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            if (auVar126._0_4_ <= fVar34) {
                              auVar126._0_4_ = fVar34;
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        *(int *)((long)mins.data +
                                uVar12 * 4 +
                                CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep
                                * (long)pMVar29) = auVar126._0_4_;
                        uVar12 = uVar12 + 1;
                        pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                      } while (uVar12 != uVar19);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar83._8_4_ = (int)lVar27;
                  auVar83._0_8_ = lVar27;
                  auVar83._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar12 = 0;
                  auVar83 = auVar83 ^ _DAT_003130e0;
                  do {
                    auVar166._8_4_ = (int)uVar12;
                    auVar166._0_8_ = uVar12;
                    auVar166._12_4_ = (int)(uVar12 >> 0x20);
                    auVar204 = (auVar166 | auVar68) ^ auVar106;
                    iVar8 = auVar83._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar83._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != auVar83._12_4_ || auVar204._8_4_ <= auVar83._8_4_) &&
                        auVar204._12_4_ <= auVar83._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar166 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar83._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0xff7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) =
                           0xff7fffff;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar30 + uVar12 * 4);
                        fVar34 = *(float *)((long)pvVar17 + uVar12 * 4);
                        if (fVar1 <= fVar34) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar17 + uVar12 * 4) = fVar1;
                        uVar12 = uVar12 + 1;
                      } while (uVar19 != uVar12);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            else {
              bVar25 = (byte)iVar8 | bVar15;
              if ((bVar25 & 1) != 0 || bVar28 != 0) {
                puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                  Mat::create(top_blob,uVar11,uVar10,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  puVar20 = (uint *)pMVar21;
                  if (0 < (int)uVar11) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar11 - 1;
                    auVar103._8_4_ = (int)lVar27;
                    auVar103._0_8_ = lVar27;
                    auVar103._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    uVar19 = 0;
                    auVar103 = auVar103 ^ _DAT_003130e0;
                    do {
                      auVar192._8_4_ = (int)uVar19;
                      auVar192._0_8_ = uVar19;
                      auVar192._12_4_ = (int)(uVar19 >> 0x20);
                      auVar204 = (auVar192 | auVar68) ^ auVar106;
                      iVar8 = auVar103._4_4_;
                      iVar201 = auVar103._12_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar103._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0xff7fffff;
                      }
                      if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar103._8_4_) &&
                          auVar204._12_4_ <= iVar201) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0xff7fffff;
                      }
                      auVar204 = (auVar192 | auVar75) ^ auVar106;
                      auVar215._0_4_ = -(uint)(auVar103._0_4_ < auVar204._0_4_);
                      auVar215._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                      auVar215._8_4_ = -(uint)(auVar103._8_4_ < auVar204._8_4_);
                      auVar215._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                      iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                      iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                      auVar230._4_4_ = iVar8;
                      auVar230._0_4_ = iVar8;
                      auVar230._8_4_ = iVar201;
                      auVar230._12_4_ = iVar201;
                      auVar193._4_4_ = auVar215._4_4_;
                      auVar193._0_4_ = auVar215._4_4_;
                      auVar193._8_4_ = auVar215._12_4_;
                      auVar193._12_4_ = auVar215._12_4_;
                      auVar194._8_4_ = 0xffffffff;
                      auVar194._0_8_ = 0xffffffffffffffff;
                      auVar194._12_4_ = 0xffffffff;
                      auVar194 = (auVar193 | auVar230 & auVar215) ^ auVar194;
                      if ((auVar194 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0xff7fffff;
                      }
                      puVar20 = (uint *)(ulong)auVar194._8_2_;
                      if ((auVar194 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar19 = uVar19 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                  }
                  if (0 < (int)uVar9) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar17 = bottom_blob->data;
                    pvVar30 = top_blob->data;
                    puVar20 = (uint *)(ulong)uVar26;
                    pMVar21 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar26) {
                        pMVar29 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                          if (fVar1 <= fVar34) {
                            fVar1 = fVar34;
                          }
                          *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                          pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        } while ((Mat *)puVar20 != pMVar29);
                      }
                      pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                    } while (pMVar21 != pMVar22);
                  }
                }
                else if (reduce_c == false && (bVar25 & 1) == 0) {
                  puVar20 = (uint *)(ulong)uVar11;
                  Mat::create(top_blob,uVar11,uVar9,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  uVar26 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar26) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar26 - 1;
                    auVar61._8_4_ = (int)lVar27;
                    auVar61._0_8_ = lVar27;
                    auVar61._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    uVar19 = 0;
                    auVar61 = auVar61 ^ _DAT_003130e0;
                    do {
                      auVar144._8_4_ = (int)uVar19;
                      auVar144._0_8_ = uVar19;
                      auVar144._12_4_ = (int)(uVar19 >> 0x20);
                      auVar204 = (auVar144 | auVar68) ^ auVar106;
                      iVar8 = auVar61._4_4_;
                      iVar201 = auVar61._12_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar61._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0xff7fffff;
                      }
                      if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar61._8_4_) &&
                          auVar204._12_4_ <= iVar201) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0xff7fffff;
                      }
                      auVar204 = (auVar144 | auVar75) ^ auVar106;
                      auVar207._0_4_ = -(uint)(auVar61._0_4_ < auVar204._0_4_);
                      auVar207._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                      auVar207._8_4_ = -(uint)(auVar61._8_4_ < auVar204._8_4_);
                      auVar207._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                      iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                      iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                      auVar222._4_4_ = iVar8;
                      auVar222._0_4_ = iVar8;
                      auVar222._8_4_ = iVar201;
                      auVar222._12_4_ = iVar201;
                      auVar145._4_4_ = auVar207._4_4_;
                      auVar145._0_4_ = auVar207._4_4_;
                      auVar145._8_4_ = auVar207._12_4_;
                      auVar145._12_4_ = auVar207._12_4_;
                      auVar146._8_4_ = 0xffffffff;
                      auVar146._0_8_ = 0xffffffffffffffff;
                      auVar146._12_4_ = 0xffffffff;
                      auVar146 = (auVar145 | auVar222 & auVar207) ^ auVar146;
                      if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0xff7fffff;
                      }
                      puVar20 = (uint *)(ulong)auVar146._8_2_;
                      if ((auVar146 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar19 = uVar19 + 4;
                    } while ((uVar26 + 3 & 0xfffffffc) != uVar19);
                  }
                  if (0 < (int)uVar9) {
                    pvVar17 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pvVar30 = top_blob->data;
                    sVar3 = bottom_blob->cstep;
                    puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
                    pMVar29 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        uVar9 = 0;
                        pvVar31 = pvVar17;
                        do {
                          if (0 < (int)uVar11) {
                            pMVar16 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                              fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                              if (fVar1 <= fVar34) {
                                fVar1 = fVar34;
                              }
                              *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            } while (pMVar21 != pMVar16);
                          }
                          uVar9 = uVar9 + 1;
                          pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar11 * 4);
                        } while (uVar9 != uVar10);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                      pvVar30 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar30);
                    } while (pMVar29 != pMVar22);
                  }
                }
                goto LAB_001ffe7c;
              }
              Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)(ulong)uVar11;
              Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar94._8_4_ = (int)lVar24;
                  auVar94._0_8_ = lVar24;
                  auVar94._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar94 = auVar94 ^ _DAT_003130e0;
                  do {
                    auVar177._8_4_ = (int)puVar20;
                    auVar177._0_8_ = puVar20;
                    auVar177._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar177 | auVar68) ^ auVar106;
                    iVar8 = auVar94._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar94._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != auVar94._12_4_ || auVar204._8_4_ <= auVar94._8_4_) &&
                        auVar204._12_4_ <= auVar94._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar177 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar94._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0xff7fffff;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar26 = 0;
                      pvVar31 = pvVar17;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                            fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            if (fVar1 <= fVar34) {
                              fVar1 = fVar34;
                            }
                            *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                      } while (uVar26 != uVar10);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                    pvVar30 = (void *)((long)pvVar30 +
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                      mins.cstep);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar10 - 1;
                  auVar95._8_4_ = (int)lVar27;
                  auVar95._0_8_ = lVar27;
                  auVar95._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar95 = auVar95 ^ _DAT_003130e0;
                  do {
                    auVar178._8_4_ = (int)uVar19;
                    auVar178._0_8_ = uVar19;
                    auVar178._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar178 | auVar68) ^ auVar106;
                    iVar8 = auVar95._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar95._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != auVar95._12_4_ || auVar204._8_4_ <= auVar95._8_4_) &&
                        auVar204._12_4_ <= auVar95._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar178 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar95._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0xff7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) =
                           0xff7fffff;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        fVar34 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                        if (fVar1 <= fVar34) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar1;
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while (pMVar21 != pMVar29);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            goto LAB_001ffe5f;
          }
          puVar20 = (uint *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar29 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar12 = 0;
                pvVar31 = pvVar17;
                do {
                  auVar120 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar11) {
                    pMVar16 = (Mat *)0x0;
                    auVar120 = ZEXT816(0xff7fffff);
                    do {
                      fVar34 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                      if (auVar120._0_4_ <= fVar34) {
                        auVar120._0_4_ = fVar34;
                      }
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar21 != pMVar16);
                  }
                  *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                       auVar120._0_4_;
                  uVar12 = uVar12 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                } while (uVar12 != uVar19);
              }
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar29 != pMVar22);
          }
        }
      }
      else if (uVar11 == 2) {
        uVar11 = bottom_blob->w;
        pMVar21 = (Mat *)(ulong)uVar11;
        uVar10 = bottom_blob->h;
        pMVar22 = (Mat *)(ulong)uVar10;
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar57._0_8_ = SUB168(auVar56 ^ auVar106,0) << 0x3f;
        auVar57._8_8_ = SUB168(auVar56 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(uVar13,auVar57);
        if (iVar8 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          puVar20 = (uint *)pMVar22;
          Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar10 < 1) {
              fVar34 = -3.4028235e+38;
            }
            else {
              pvVar17 = bottom_blob->data;
              iVar8 = bottom_blob->w;
              sVar2 = bottom_blob->elemsize;
              puVar20 = (uint *)0x0;
              do {
                fVar34 = -3.4028235e+38;
                if (0 < (int)uVar11) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    if (fVar34 <= fVar1) {
                      fVar34 = fVar1;
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while (pMVar21 != pMVar29);
                }
                *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
                puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
              } while ((Mat *)puVar20 != pMVar22);
              fVar34 = -3.4028235e+38;
              pMVar21 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
                if (fVar34 <= fVar1) {
                  fVar34 = fVar1;
                }
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001fee6a;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto LAB_001ffe6e;
        }
        if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
          puVar20 = (uint *)pMVar22;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          if (0 < (int)uVar10) {
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar17 = bottom_blob->data;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = -3.4028235e+38;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar34 <= fVar1) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
        else if (((bVar15 | (byte)iVar8) & 1) == 0) {
          puVar20 = (uint *)pMVar21;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          auVar68 = _DAT_003136b0;
          auVar75 = _DAT_003136a0;
          auVar106 = _DAT_003130e0;
          uVar9 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar9) {
            pvVar17 = top_blob->data;
            lVar27 = (ulong)uVar9 - 1;
            auVar58._8_4_ = (int)lVar27;
            auVar58._0_8_ = lVar27;
            auVar58._12_4_ = (int)((ulong)lVar27 >> 0x20);
            uVar19 = 0;
            auVar58 = auVar58 ^ _DAT_003130e0;
            do {
              auVar141._8_4_ = (int)uVar19;
              auVar141._0_8_ = uVar19;
              auVar141._12_4_ = (int)(uVar19 >> 0x20);
              auVar204 = (auVar141 | auVar68) ^ auVar106;
              iVar8 = auVar58._4_4_;
              iVar201 = auVar58._12_4_;
              if ((bool)(~(auVar204._4_4_ == iVar8 && auVar58._0_4_ < auVar204._0_4_ ||
                          iVar8 < auVar204._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0xff7fffff;
              }
              if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar58._8_4_) &&
                  auVar204._12_4_ <= iVar201) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0xff7fffff;
              }
              auVar204 = (auVar141 | auVar75) ^ auVar106;
              auVar206._0_4_ = -(uint)(auVar58._0_4_ < auVar204._0_4_);
              auVar206._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
              auVar206._8_4_ = -(uint)(auVar58._8_4_ < auVar204._8_4_);
              auVar206._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
              iVar8 = -(uint)(auVar204._4_4_ == iVar8);
              iVar201 = -(uint)(auVar204._12_4_ == iVar201);
              auVar221._4_4_ = iVar8;
              auVar221._0_4_ = iVar8;
              auVar221._8_4_ = iVar201;
              auVar221._12_4_ = iVar201;
              auVar142._4_4_ = auVar206._4_4_;
              auVar142._0_4_ = auVar206._4_4_;
              auVar142._8_4_ = auVar206._12_4_;
              auVar142._12_4_ = auVar206._12_4_;
              auVar143._8_4_ = 0xffffffff;
              auVar143._0_8_ = 0xffffffffffffffff;
              auVar143._12_4_ = 0xffffffff;
              auVar143 = (auVar142 | auVar221 & auVar206) ^ auVar143;
              if ((auVar143 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0xff7fffff;
              }
              puVar20 = (uint *)(ulong)auVar143._8_2_;
              if ((auVar143 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0xff7fffff;
              }
              uVar19 = uVar19 + 4;
            } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
          }
          if (0 < (int)uVar10) {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                  if (fVar1 <= fVar34) {
                    fVar1 = fVar34;
                  }
                  *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
      }
      else if (uVar11 == 1) {
        iVar8 = bottom_blob->w;
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar8 < 1) goto LAB_001fa64b;
        fVar34 = -3.4028235e+38;
        lVar27 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar27 * 4);
          if (fVar34 <= fVar1) {
            fVar34 = fVar1;
          }
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
        goto LAB_001fa658;
      }
    }
    else if (uVar11 == 3) {
      uVar11 = bottom_blob->w;
      lVar27 = (long)(int)uVar11;
      uVar10 = bottom_blob->h;
      uVar19 = (ulong)uVar10;
      uVar9 = bottom_blob->c;
      pMVar22 = (Mat *)(ulong)uVar9;
      uVar26 = uVar10 * uVar11;
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar41._0_8_ = SUB168(auVar40 ^ auVar106,0) << 0x3f;
      auVar41._8_8_ = SUB168(auVar40 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(3,auVar41);
      bVar28 = reduce_c ^ 1;
      if (iVar8 == 0 && bVar28 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar9 < 1) {
            fVar34 = -3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar17 = bottom_blob->data;
            puVar20 = (uint *)(ulong)uVar26;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = -3.4028235e+38;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar34 <= fVar1) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)puVar20 != pMVar29);
              }
              *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar21 != pMVar22);
            fVar34 = -3.4028235e+38;
            pMVar21 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
              if (fVar34 <= fVar1) {
                fVar34 = fVar1;
              }
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) {
joined_r0x001fee6a:
              mins.data = puVar20;
              if ((Mat *)puVar20 != (Mat *)0x0) {
                free(puVar20);
              }
            }
            else {
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
        }
LAB_001ffe6e:
        if (iVar8 != 0) {
          return -100;
        }
      }
      else if (iVar8 == 0 && reduce_c == false) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,1,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar21 = (Mat *)0x0;
          do {
            fVar34 = -3.4028235e+38;
            if (0 < (int)uVar26) {
              uVar19 = 0;
              fVar34 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar17 + uVar19 * 4);
                if (fVar34 <= fVar1) {
                  fVar34 = fVar1;
                }
                uVar19 = uVar19 + 1;
              } while (uVar26 != uVar19);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * (long)pMVar21) = fVar34;
            pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar21 != pMVar22);
        }
      }
      else {
        pMVar21 = (Mat *)(ulong)uVar11;
        bVar25 = (byte)iVar8 >> 1 | bVar14;
        if (reduce_c != false || (bVar25 & 1) != 0) {
          if ((bVar25 & 1) == 0 && bVar28 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)0x1;
            Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar76._8_4_ = (int)lVar24;
                auVar76._0_8_ = lVar24;
                auVar76._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar76 = auVar76 ^ _DAT_003130e0;
                do {
                  auVar159._8_4_ = (int)puVar20;
                  auVar159._0_8_ = puVar20;
                  auVar159._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar159 | auVar68) ^ auVar106;
                  iVar8 = auVar76._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar76._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0xff7fffff;
                  }
                  if ((auVar204._12_4_ != auVar76._12_4_ || auVar204._8_4_ <= auVar76._8_4_) &&
                      auVar204._12_4_ <= auVar76._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0xff7fffff;
                  }
                  auVar204 = (auVar159 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar76._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0xff7fffff;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    pvVar30 = pvVar17;
                    do {
                      auVar123 = ZEXT816(0xff7fffff);
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        auVar123 = ZEXT816(0xff7fffff);
                        do {
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          if (auVar123._0_4_ <= fVar34) {
                            auVar123._0_4_ = fVar34;
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      *(int *)((long)mins.data +
                              uVar12 * 4 +
                              CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep *
                              (long)pMVar29) = auVar123._0_4_;
                      uVar12 = uVar12 + 1;
                      pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                    } while (uVar12 != uVar19);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar11 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar11) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar11 - 1;
                auVar77._8_4_ = (int)lVar27;
                auVar77._0_8_ = lVar27;
                auVar77._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar12 = 0;
                auVar77 = auVar77 ^ _DAT_003130e0;
                do {
                  auVar160._8_4_ = (int)uVar12;
                  auVar160._0_8_ = uVar12;
                  auVar160._12_4_ = (int)(uVar12 >> 0x20);
                  auVar204 = (auVar160 | auVar68) ^ auVar106;
                  iVar8 = auVar77._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar77._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0xff7fffff;
                  }
                  if ((auVar204._12_4_ != auVar77._12_4_ || auVar204._8_4_ <= auVar77._8_4_) &&
                      auVar204._12_4_ <= auVar77._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0xff7fffff;
                  }
                  auVar204 = (auVar160 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar77._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0xff7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) = 0xff7fffff
                    ;
                  }
                  uVar12 = uVar12 + 4;
                } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar30 + uVar12 * 4);
                      fVar34 = *(float *)((long)pvVar17 + uVar12 * 4);
                      if (fVar1 <= fVar34) {
                        fVar1 = fVar34;
                      }
                      *(float *)((long)pvVar17 + uVar12 * 4) = fVar1;
                      uVar12 = uVar12 + 1;
                    } while (uVar19 != uVar12);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
          else {
            bVar25 = (byte)iVar8 | bVar15;
            if ((bVar25 & 1) != 0 || bVar28 != 0) {
              puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
              if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                Mat::create(top_blob,uVar11,uVar10,1,sVar2,opt->blob_allocator);
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                puVar20 = (uint *)pMVar21;
                if (0 < (int)uVar11) {
                  pvVar17 = top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar100._8_4_ = (int)lVar27;
                  auVar100._0_8_ = lVar27;
                  auVar100._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar100 = auVar100 ^ _DAT_003130e0;
                  do {
                    auVar183._8_4_ = (int)uVar19;
                    auVar183._0_8_ = uVar19;
                    auVar183._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar183 | auVar68) ^ auVar106;
                    iVar8 = auVar100._4_4_;
                    iVar201 = auVar100._12_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar100._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar100._8_4_) &&
                        auVar204._12_4_ <= iVar201) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar183 | auVar75) ^ auVar106;
                    auVar212._0_4_ = -(uint)(auVar100._0_4_ < auVar204._0_4_);
                    auVar212._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                    auVar212._8_4_ = -(uint)(auVar100._8_4_ < auVar204._8_4_);
                    auVar212._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                    iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                    iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                    auVar227._4_4_ = iVar8;
                    auVar227._0_4_ = iVar8;
                    auVar227._8_4_ = iVar201;
                    auVar227._12_4_ = iVar201;
                    auVar184._4_4_ = auVar212._4_4_;
                    auVar184._0_4_ = auVar212._4_4_;
                    auVar184._8_4_ = auVar212._12_4_;
                    auVar184._12_4_ = auVar212._12_4_;
                    auVar185._8_4_ = 0xffffffff;
                    auVar185._0_8_ = 0xffffffffffffffff;
                    auVar185._12_4_ = 0xffffffff;
                    auVar185 = (auVar184 | auVar227 & auVar212) ^ auVar185;
                    if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0xff7fffff;
                    }
                    puVar20 = (uint *)(ulong)auVar185._8_2_;
                    if ((auVar185 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                }
                if (0 < (int)uVar9) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar17 = bottom_blob->data;
                  pvVar30 = top_blob->data;
                  puVar20 = (uint *)(ulong)uVar26;
                  pMVar21 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar26) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                        fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        if (fVar1 <= fVar34) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while ((Mat *)puVar20 != pMVar29);
                    }
                    pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                  } while (pMVar21 != pMVar22);
                }
              }
              else if (reduce_c == false && (bVar25 & 1) == 0) {
                puVar20 = (uint *)(ulong)uVar11;
                Mat::create(top_blob,uVar11,1,uVar9,sVar2,opt->blob_allocator);
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                sVar2 = top_blob->cstep;
                uVar26 = top_blob->c * (int)sVar2;
                if (0 < (int)uVar26) {
                  pvVar17 = top_blob->data;
                  lVar27 = (ulong)uVar26 - 1;
                  auVar42._8_4_ = (int)lVar27;
                  auVar42._0_8_ = lVar27;
                  auVar42._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar42 = auVar42 ^ _DAT_003130e0;
                  do {
                    auVar132._8_4_ = (int)puVar20;
                    auVar132._0_8_ = puVar20;
                    auVar132._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar132 | auVar68) ^ auVar106;
                    iVar8 = auVar42._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar42._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4) = 0xff7fffff;
                    }
                    if ((auVar204._12_4_ != auVar42._12_4_ || auVar204._8_4_ <= auVar42._8_4_) &&
                        auVar204._12_4_ <= auVar42._12_4_) {
                      *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 4) = 0xff7fffff;
                    }
                    auVar204 = (auVar132 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar42._0_4_)) {
                      *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 0xc) = 0xff7fffff;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  sVar3 = bottom_blob->elemsize;
                  puVar20 = (uint *)top_blob->data;
                  sVar5 = bottom_blob->cstep;
                  sVar4 = top_blob->elemsize;
                  pMVar29 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar9 = 0;
                      pvVar30 = pvVar17;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            fVar34 = *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4);
                            if (fVar1 <= fVar34) {
                              fVar1 = fVar34;
                            }
                            *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4) = fVar1;
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        uVar9 = uVar9 + 1;
                        pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar11 * 4);
                      } while (uVar9 != uVar10);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + sVar3 * sVar5);
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + sVar2 * sVar4);
                  } while (pMVar29 != pMVar22);
                }
              }
              goto LAB_001ffe7c;
            }
            Mat::create(top_blob,uVar11,1,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)(ulong)uVar11;
            Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar88._8_4_ = (int)lVar24;
                auVar88._0_8_ = lVar24;
                auVar88._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar88 = auVar88 ^ _DAT_003130e0;
                do {
                  auVar171._8_4_ = (int)puVar20;
                  auVar171._0_8_ = puVar20;
                  auVar171._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar171 | auVar68) ^ auVar106;
                  iVar8 = auVar88._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar88._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0xff7fffff;
                  }
                  if ((auVar204._12_4_ != auVar88._12_4_ || auVar204._8_4_ <= auVar88._8_4_) &&
                      auVar204._12_4_ <= auVar88._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0xff7fffff;
                  }
                  auVar204 = (auVar171 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar88._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0xff7fffff;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0xff7fffff;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar26 = 0;
                    pvVar31 = pvVar17;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          if (fVar1 <= fVar34) {
                            fVar1 = fVar34;
                          }
                          *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      uVar26 = uVar26 + 1;
                      pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                    } while (uVar26 != uVar10);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  pvVar30 = (void *)((long)pvVar30 +
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                    mins.cstep);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar10 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar10) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar10 - 1;
                auVar89._8_4_ = (int)lVar27;
                auVar89._0_8_ = lVar27;
                auVar89._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar19 = 0;
                auVar89 = auVar89 ^ _DAT_003130e0;
                do {
                  auVar172._8_4_ = (int)uVar19;
                  auVar172._0_8_ = uVar19;
                  auVar172._12_4_ = (int)(uVar19 >> 0x20);
                  auVar204 = (auVar172 | auVar68) ^ auVar106;
                  iVar8 = auVar89._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar89._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0xff7fffff;
                  }
                  if ((auVar204._12_4_ != auVar89._12_4_ || auVar204._8_4_ <= auVar89._8_4_) &&
                      auVar204._12_4_ <= auVar89._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0xff7fffff;
                  }
                  auVar204 = (auVar172 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar89._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0xff7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) = 0xff7fffff
                    ;
                  }
                  uVar19 = uVar19 + 4;
                } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar29 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                      fVar34 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                      if (fVar1 <= fVar34) {
                        fVar1 = fVar34;
                      }
                      *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar1;
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    } while (pMVar21 != pMVar29);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
LAB_001ffe5f:
          Mat::~Mat(&mins);
          goto LAB_001ffe6e;
        }
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar29 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              uVar12 = 0;
              pvVar31 = pvVar17;
              do {
                auVar117 = ZEXT816(0xff7fffff);
                if (0 < (int)uVar11) {
                  pMVar16 = (Mat *)0x0;
                  auVar117 = ZEXT816(0xff7fffff);
                  do {
                    fVar34 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                    if (auVar117._0_4_ <= fVar34) {
                      auVar117._0_4_ = fVar34;
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar21 != pMVar16);
                }
                *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                     auVar117._0_4_;
                uVar12 = uVar12 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
              } while (uVar12 != uVar19);
            }
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar29 != pMVar22);
        }
      }
    }
    else if (uVar11 == 2) {
      uVar11 = bottom_blob->w;
      pMVar21 = (Mat *)(ulong)uVar11;
      uVar10 = bottom_blob->h;
      pMVar22 = (Mat *)(ulong)uVar10;
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar38._0_8_ = SUB168(auVar37 ^ auVar106,0) << 0x3f;
      auVar38._8_8_ = SUB168(auVar37 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar38);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar10 < 1) {
            fVar34 = -3.4028235e+38;
          }
          else {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = -3.4028235e+38;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar34 <= fVar1) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
            fVar34 = -3.4028235e+38;
            pMVar21 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
              if (fVar34 <= fVar1) {
                fVar34 = fVar1;
              }
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) goto joined_r0x001fee6a;
            (*(mins.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_001ffe6e;
      }
      if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        if (0 < (int)uVar10) {
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar17 = bottom_blob->data;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            fVar34 = -3.4028235e+38;
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              fVar34 = -3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                if (fVar34 <= fVar1) {
                  fVar34 = fVar1;
                }
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
      else if (((bVar15 | (byte)iVar8) & 1) == 0) {
        puVar20 = (uint *)pMVar21;
        Mat::create(top_blob,uVar11,1,sVar2,opt->blob_allocator);
        auVar68 = _DAT_003136b0;
        auVar75 = _DAT_003136a0;
        auVar106 = _DAT_003130e0;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar17 = top_blob->data;
          lVar27 = (ulong)uVar9 - 1;
          auVar39._8_4_ = (int)lVar27;
          auVar39._0_8_ = lVar27;
          auVar39._12_4_ = (int)((ulong)lVar27 >> 0x20);
          uVar19 = 0;
          auVar39 = auVar39 ^ _DAT_003130e0;
          do {
            auVar129._8_4_ = (int)uVar19;
            auVar129._0_8_ = uVar19;
            auVar129._12_4_ = (int)(uVar19 >> 0x20);
            auVar204 = (auVar129 | auVar68) ^ auVar106;
            iVar8 = auVar39._4_4_;
            iVar201 = auVar39._12_4_;
            if ((bool)(~(auVar204._4_4_ == iVar8 && auVar39._0_4_ < auVar204._0_4_ ||
                        iVar8 < auVar204._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0xff7fffff;
            }
            if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar39._8_4_) &&
                auVar204._12_4_ <= iVar201) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0xff7fffff;
            }
            auVar204 = (auVar129 | auVar75) ^ auVar106;
            auVar202._0_4_ = -(uint)(auVar39._0_4_ < auVar204._0_4_);
            auVar202._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
            auVar202._8_4_ = -(uint)(auVar39._8_4_ < auVar204._8_4_);
            auVar202._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
            iVar8 = -(uint)(auVar204._4_4_ == iVar8);
            iVar201 = -(uint)(auVar204._12_4_ == iVar201);
            auVar218._4_4_ = iVar8;
            auVar218._0_4_ = iVar8;
            auVar218._8_4_ = iVar201;
            auVar218._12_4_ = iVar201;
            auVar130._4_4_ = auVar202._4_4_;
            auVar130._0_4_ = auVar202._4_4_;
            auVar130._8_4_ = auVar202._12_4_;
            auVar130._12_4_ = auVar202._12_4_;
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            auVar131 = (auVar130 | auVar218 & auVar202) ^ auVar131;
            if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0xff7fffff;
            }
            puVar20 = (uint *)(ulong)auVar131._8_2_;
            if ((auVar131 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0xff7fffff;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar10) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                if (fVar1 <= fVar34) {
                  fVar1 = fVar34;
                }
                *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
    }
    else if (uVar11 == 1) {
      iVar8 = bottom_blob->w;
      puVar20 = (uint *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar8 < 1) {
LAB_001fa64b:
        fVar34 = -3.4028235e+38;
      }
      else {
        fVar34 = -3.4028235e+38;
        lVar27 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar27 * 4);
          if (fVar34 <= fVar1) {
            fVar34 = fVar1;
          }
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
      }
LAB_001fa658:
      *(float *)top_blob->data = fVar34;
    }
LAB_001ffe7c:
    if (ABS(fVar33 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_002005d6;
  case 5:
    fVar33 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar11 == 3) {
        uVar11 = bottom_blob->w;
        lVar27 = (long)(int)uVar11;
        uVar10 = bottom_blob->h;
        uVar19 = (ulong)uVar10;
        uVar9 = bottom_blob->c;
        pMVar22 = (Mat *)(ulong)uVar9;
        uVar26 = uVar10 * uVar11;
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar70._0_8_ = SUB168(auVar69 ^ auVar106,0) << 0x3f;
        auVar70._8_8_ = SUB168(auVar69 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(3,auVar70);
        bVar28 = reduce_c ^ 1;
        puVar20 = (uint *)pMVar22;
        if (iVar8 == 0 && bVar28 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar9 < 1) {
              fVar34 = 3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar17 = bottom_blob->data;
              puVar20 = (uint *)(ulong)uVar26;
              pMVar21 = (Mat *)0x0;
              do {
                fVar34 = 3.4028235e+38;
                if (0 < (int)uVar26) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    if (fVar1 <= fVar34) {
                      fVar34 = fVar1;
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while ((Mat *)puVar20 != pMVar29);
                }
                *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              } while (pMVar21 != pMVar22);
              fVar34 = 3.4028235e+38;
              pMVar21 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
                if (fVar1 <= fVar34) {
                  fVar34 = fVar1;
                }
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feea1;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto joined_r0x002005a8;
        }
        if (iVar8 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)(ulong)uVar26;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = 3.4028235e+38;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar1 <= fVar34) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)puVar20 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar21 != pMVar22);
          }
        }
        else {
          pMVar21 = (Mat *)(ulong)uVar11;
          bVar25 = (byte)iVar8 >> 1 | bVar14;
          if (reduce_c != false || (bVar25 & 1) != 0) {
            if ((bVar25 & 1) == 0 && bVar28 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)0x1;
              Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar84._8_4_ = (int)lVar24;
                  auVar84._0_8_ = lVar24;
                  auVar84._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar84 = auVar84 ^ _DAT_003130e0;
                  do {
                    auVar167._8_4_ = (int)puVar20;
                    auVar167._0_8_ = puVar20;
                    auVar167._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar167 | auVar68) ^ auVar106;
                    iVar8 = auVar84._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar84._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x7f7fffff;
                    }
                    if ((auVar204._12_4_ != auVar84._12_4_ || auVar204._8_4_ <= auVar84._8_4_) &&
                        auVar204._12_4_ <= auVar84._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar204 = (auVar167 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar84._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x7f7fffff;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x7f7fffff;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      pvVar30 = pvVar17;
                      do {
                        auVar127 = ZEXT816(0x7f7fffff);
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          auVar127 = ZEXT816(0x7f7fffff);
                          do {
                            fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            if (fVar34 <= auVar127._0_4_) {
                              auVar127._0_4_ = fVar34;
                            }
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        *(int *)((long)mins.data +
                                uVar12 * 4 +
                                CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep
                                * (long)pMVar29) = auVar127._0_4_;
                        uVar12 = uVar12 + 1;
                        pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                      } while (uVar12 != uVar19);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar85._8_4_ = (int)lVar27;
                  auVar85._0_8_ = lVar27;
                  auVar85._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar12 = 0;
                  auVar85 = auVar85 ^ _DAT_003130e0;
                  do {
                    auVar168._8_4_ = (int)uVar12;
                    auVar168._0_8_ = uVar12;
                    auVar168._12_4_ = (int)(uVar12 >> 0x20);
                    auVar204 = (auVar168 | auVar68) ^ auVar106;
                    iVar8 = auVar85._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar85._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0x7f7fffff;
                    }
                    if ((auVar204._12_4_ != auVar85._12_4_ || auVar204._8_4_ <= auVar85._8_4_) &&
                        auVar204._12_4_ <= auVar85._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar204 = (auVar168 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar85._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) =
                           0x7f7fffff;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar30 + uVar12 * 4);
                        fVar34 = *(float *)((long)pvVar17 + uVar12 * 4);
                        if (fVar34 <= fVar1) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar17 + uVar12 * 4) = fVar1;
                        uVar12 = uVar12 + 1;
                      } while (uVar19 != uVar12);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            else {
              bVar25 = (byte)iVar8 | bVar15;
              if ((bVar25 & 1) != 0 || bVar28 != 0) {
                if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                  Mat::create(top_blob,uVar11,uVar10,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar11 - 1;
                    auVar104._8_4_ = (int)lVar27;
                    auVar104._0_8_ = lVar27;
                    auVar104._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    uVar19 = 0;
                    auVar104 = auVar104 ^ _DAT_003130e0;
                    do {
                      auVar195._8_4_ = (int)uVar19;
                      auVar195._0_8_ = uVar19;
                      auVar195._12_4_ = (int)(uVar19 >> 0x20);
                      auVar204 = (auVar195 | auVar68) ^ auVar106;
                      iVar8 = auVar104._4_4_;
                      iVar201 = auVar104._12_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar104._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x7f7fffff;
                      }
                      if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar104._8_4_) &&
                          auVar204._12_4_ <= iVar201) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar204 = (auVar195 | auVar75) ^ auVar106;
                      auVar216._0_4_ = -(uint)(auVar104._0_4_ < auVar204._0_4_);
                      auVar216._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                      auVar216._8_4_ = -(uint)(auVar104._8_4_ < auVar204._8_4_);
                      auVar216._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                      iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                      iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                      auVar231._4_4_ = iVar8;
                      auVar231._0_4_ = iVar8;
                      auVar231._8_4_ = iVar201;
                      auVar231._12_4_ = iVar201;
                      auVar196._4_4_ = auVar216._4_4_;
                      auVar196._0_4_ = auVar216._4_4_;
                      auVar196._8_4_ = auVar216._12_4_;
                      auVar196._12_4_ = auVar216._12_4_;
                      auVar197._8_4_ = 0xffffffff;
                      auVar197._0_8_ = 0xffffffffffffffff;
                      auVar197._12_4_ = 0xffffffff;
                      auVar197 = (auVar196 | auVar231 & auVar216) ^ auVar197;
                      if ((auVar197 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar21 = (Mat *)(ulong)auVar197._8_2_;
                      if ((auVar197 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar19 = uVar19 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                  }
                  puVar20 = (uint *)pMVar21;
                  if (0 < (int)uVar9) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar17 = bottom_blob->data;
                    pvVar30 = top_blob->data;
                    puVar20 = (uint *)(ulong)uVar26;
                    pMVar21 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar26) {
                        pMVar29 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                          if (fVar34 <= fVar1) {
                            fVar1 = fVar34;
                          }
                          *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                          pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        } while ((Mat *)puVar20 != pMVar29);
                      }
                      pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                    } while (pMVar21 != pMVar22);
                  }
                }
                else {
                  puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                  if (reduce_c == false && (bVar25 & 1) == 0) {
                    puVar20 = (uint *)(ulong)uVar11;
                    Mat::create(top_blob,uVar11,uVar9,sVar2,opt->blob_allocator);
                    auVar68 = _DAT_003136b0;
                    auVar75 = _DAT_003136a0;
                    auVar106 = _DAT_003130e0;
                    uVar26 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar26) {
                      pvVar17 = top_blob->data;
                      lVar27 = (ulong)uVar26 - 1;
                      auVar71._8_4_ = (int)lVar27;
                      auVar71._0_8_ = lVar27;
                      auVar71._12_4_ = (int)((ulong)lVar27 >> 0x20);
                      uVar19 = 0;
                      auVar71 = auVar71 ^ _DAT_003130e0;
                      do {
                        auVar153._8_4_ = (int)uVar19;
                        auVar153._0_8_ = uVar19;
                        auVar153._12_4_ = (int)(uVar19 >> 0x20);
                        auVar204 = (auVar153 | auVar68) ^ auVar106;
                        iVar8 = auVar71._4_4_;
                        iVar201 = auVar71._12_4_;
                        if ((bool)(~(auVar204._4_4_ == iVar8 && auVar71._0_4_ < auVar204._0_4_ ||
                                    iVar8 < auVar204._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x7f7fffff;
                        }
                        if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar71._8_4_) &&
                            auVar204._12_4_ <= iVar201) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar204 = (auVar153 | auVar75) ^ auVar106;
                        auVar210._0_4_ = -(uint)(auVar71._0_4_ < auVar204._0_4_);
                        auVar210._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                        auVar210._8_4_ = -(uint)(auVar71._8_4_ < auVar204._8_4_);
                        auVar210._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                        iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                        iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                        auVar225._4_4_ = iVar8;
                        auVar225._0_4_ = iVar8;
                        auVar225._8_4_ = iVar201;
                        auVar225._12_4_ = iVar201;
                        auVar154._4_4_ = auVar210._4_4_;
                        auVar154._0_4_ = auVar210._4_4_;
                        auVar154._8_4_ = auVar210._12_4_;
                        auVar154._12_4_ = auVar210._12_4_;
                        auVar155._8_4_ = 0xffffffff;
                        auVar155._0_8_ = 0xffffffffffffffff;
                        auVar155._12_4_ = 0xffffffff;
                        auVar155 = (auVar154 | auVar225 & auVar210) ^ auVar155;
                        if ((auVar155 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x7f7fffff;
                        }
                        puVar20 = (uint *)(ulong)auVar155._8_2_;
                        if ((auVar155 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x7f7fffff;
                        }
                        uVar19 = uVar19 + 4;
                      } while ((uVar26 + 3 & 0xfffffffc) != uVar19);
                    }
                    if (0 < (int)uVar9) {
                      pvVar17 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar30 = top_blob->data;
                      sVar3 = bottom_blob->cstep;
                      puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
                      pMVar29 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar10) {
                          uVar9 = 0;
                          pvVar31 = pvVar17;
                          do {
                            if (0 < (int)uVar11) {
                              pMVar16 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                                fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                                if (fVar34 <= fVar1) {
                                  fVar1 = fVar34;
                                }
                                *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              } while (pMVar21 != pMVar16);
                            }
                            uVar9 = uVar9 + 1;
                            pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar11 * 4);
                          } while (uVar9 != uVar10);
                        }
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                        pvVar30 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar30);
                      } while (pMVar29 != pMVar22);
                    }
                  }
                }
                break;
              }
              Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)(ulong)uVar11;
              Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar96._8_4_ = (int)lVar24;
                  auVar96._0_8_ = lVar24;
                  auVar96._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar96 = auVar96 ^ _DAT_003130e0;
                  do {
                    auVar179._8_4_ = (int)puVar20;
                    auVar179._0_8_ = puVar20;
                    auVar179._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar179 | auVar68) ^ auVar106;
                    iVar8 = auVar96._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar96._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x7f7fffff;
                    }
                    if ((auVar204._12_4_ != auVar96._12_4_ || auVar204._8_4_ <= auVar96._8_4_) &&
                        auVar204._12_4_ <= auVar96._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar204 = (auVar179 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar96._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x7f7fffff;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x7f7fffff;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar26 = 0;
                      pvVar31 = pvVar17;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                            fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            if (fVar34 <= fVar1) {
                              fVar1 = fVar34;
                            }
                            *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                      } while (uVar26 != uVar10);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                    pvVar30 = (void *)((long)pvVar30 +
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                      mins.cstep);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar10 - 1;
                  auVar97._8_4_ = (int)lVar27;
                  auVar97._0_8_ = lVar27;
                  auVar97._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar97 = auVar97 ^ _DAT_003130e0;
                  do {
                    auVar180._8_4_ = (int)uVar19;
                    auVar180._0_8_ = uVar19;
                    auVar180._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar180 | auVar68) ^ auVar106;
                    iVar8 = auVar97._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar97._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0x7f7fffff;
                    }
                    if ((auVar204._12_4_ != auVar97._12_4_ || auVar204._8_4_ <= auVar97._8_4_) &&
                        auVar204._12_4_ <= auVar97._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar204 = (auVar180 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar97._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0x7f7fffff;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) =
                           0x7f7fffff;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        fVar34 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                        if (fVar34 <= fVar1) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar1;
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while (pMVar21 != pMVar29);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            goto LAB_002001f8;
          }
          puVar20 = (uint *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar29 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar12 = 0;
                pvVar31 = pvVar17;
                do {
                  auVar121 = ZEXT816(0x7f7fffff);
                  if (0 < (int)uVar11) {
                    pMVar16 = (Mat *)0x0;
                    auVar121 = ZEXT816(0x7f7fffff);
                    do {
                      fVar34 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                      if (fVar34 <= auVar121._0_4_) {
                        auVar121._0_4_ = fVar34;
                      }
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar21 != pMVar16);
                  }
                  *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                       auVar121._0_4_;
                  uVar12 = uVar12 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                } while (uVar12 != uVar19);
              }
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar29 != pMVar22);
          }
        }
      }
      else if (uVar11 == 2) {
        uVar11 = bottom_blob->w;
        pMVar21 = (Mat *)(ulong)uVar11;
        uVar10 = bottom_blob->h;
        pMVar22 = (Mat *)(ulong)uVar10;
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar63._0_8_ = SUB168(auVar62 ^ auVar106,0) << 0x3f;
        auVar63._8_8_ = SUB168(auVar62 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(uVar13,auVar63);
        if (iVar8 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          puVar20 = (uint *)pMVar22;
          Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar10 < 1) {
              fVar34 = 3.4028235e+38;
            }
            else {
              pvVar17 = bottom_blob->data;
              iVar8 = bottom_blob->w;
              sVar2 = bottom_blob->elemsize;
              puVar20 = (uint *)0x0;
              do {
                fVar34 = 3.4028235e+38;
                if (0 < (int)uVar11) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    if (fVar1 <= fVar34) {
                      fVar34 = fVar1;
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while (pMVar21 != pMVar29);
                }
                *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
                puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
              } while ((Mat *)puVar20 != pMVar22);
              fVar34 = 3.4028235e+38;
              pMVar21 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
                if (fVar1 <= fVar34) {
                  fVar34 = fVar1;
                }
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feea1;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto joined_r0x002005a8;
        }
        if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
          puVar20 = (uint *)pMVar22;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          if (0 < (int)uVar10) {
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar17 = bottom_blob->data;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = 3.4028235e+38;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar1 <= fVar34) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
        else if (((bVar15 | (byte)iVar8) & 1) == 0) {
          puVar20 = (uint *)pMVar21;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          auVar68 = _DAT_003136b0;
          auVar75 = _DAT_003136a0;
          auVar106 = _DAT_003130e0;
          uVar9 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar9) {
            pvVar17 = top_blob->data;
            lVar27 = (ulong)uVar9 - 1;
            auVar64._8_4_ = (int)lVar27;
            auVar64._0_8_ = lVar27;
            auVar64._12_4_ = (int)((ulong)lVar27 >> 0x20);
            uVar19 = 0;
            auVar64 = auVar64 ^ _DAT_003130e0;
            do {
              auVar147._8_4_ = (int)uVar19;
              auVar147._0_8_ = uVar19;
              auVar147._12_4_ = (int)(uVar19 >> 0x20);
              auVar204 = (auVar147 | auVar68) ^ auVar106;
              iVar8 = auVar64._4_4_;
              iVar201 = auVar64._12_4_;
              if ((bool)(~(auVar204._4_4_ == iVar8 && auVar64._0_4_ < auVar204._0_4_ ||
                          iVar8 < auVar204._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x7f7fffff;
              }
              if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar64._8_4_) &&
                  auVar204._12_4_ <= iVar201) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x7f7fffff;
              }
              auVar204 = (auVar147 | auVar75) ^ auVar106;
              auVar208._0_4_ = -(uint)(auVar64._0_4_ < auVar204._0_4_);
              auVar208._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
              auVar208._8_4_ = -(uint)(auVar64._8_4_ < auVar204._8_4_);
              auVar208._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
              iVar8 = -(uint)(auVar204._4_4_ == iVar8);
              iVar201 = -(uint)(auVar204._12_4_ == iVar201);
              auVar223._4_4_ = iVar8;
              auVar223._0_4_ = iVar8;
              auVar223._8_4_ = iVar201;
              auVar223._12_4_ = iVar201;
              auVar148._4_4_ = auVar208._4_4_;
              auVar148._0_4_ = auVar208._4_4_;
              auVar148._8_4_ = auVar208._12_4_;
              auVar148._12_4_ = auVar208._12_4_;
              auVar149._8_4_ = 0xffffffff;
              auVar149._0_8_ = 0xffffffffffffffff;
              auVar149._12_4_ = 0xffffffff;
              auVar149 = (auVar148 | auVar223 & auVar208) ^ auVar149;
              if ((auVar149 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x7f7fffff;
              }
              puVar20 = (uint *)(ulong)auVar149._8_2_;
              if ((auVar149 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar19 = uVar19 + 4;
            } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
          }
          if (0 < (int)uVar10) {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                  if (fVar34 <= fVar1) {
                    fVar1 = fVar34;
                  }
                  *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
      }
      else if (uVar11 == 1) {
        iVar8 = bottom_blob->w;
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar8 < 1) goto LAB_001faf93;
        fVar34 = 3.4028235e+38;
        lVar27 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar27 * 4);
          if (fVar1 <= fVar34) {
            fVar34 = fVar1;
          }
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
        goto LAB_001fafa0;
      }
    }
    else if (uVar11 == 3) {
      uVar11 = bottom_blob->w;
      lVar27 = (long)(int)uVar11;
      uVar10 = bottom_blob->h;
      uVar19 = (ulong)uVar10;
      uVar9 = bottom_blob->c;
      pMVar22 = (Mat *)(ulong)uVar9;
      uVar26 = uVar10 * uVar11;
      auVar50._8_4_ = 0xffffffff;
      auVar50._0_8_ = 0xffffffffffffffff;
      auVar50._12_4_ = 0xffffffff;
      auVar51._0_8_ = SUB168(auVar50 ^ auVar106,0) << 0x3f;
      auVar51._8_8_ = SUB168(auVar50 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(3,auVar51);
      bVar28 = reduce_c ^ 1;
      if (iVar8 == 0 && bVar28 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar9 < 1) {
            fVar34 = 3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar17 = bottom_blob->data;
            puVar20 = (uint *)(ulong)uVar26;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = 3.4028235e+38;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar1 <= fVar34) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)puVar20 != pMVar29);
              }
              *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar21 != pMVar22);
            fVar34 = 3.4028235e+38;
            pMVar21 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
              if (fVar1 <= fVar34) {
                fVar34 = fVar1;
              }
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) {
joined_r0x001feea1:
              mins.data = puVar20;
              if ((Mat *)puVar20 != (Mat *)0x0) {
                free(puVar20);
              }
            }
            else {
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto joined_r0x002005a8;
      }
      if (iVar8 == 0 && reduce_c == false) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,1,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar21 = (Mat *)0x0;
          do {
            fVar34 = 3.4028235e+38;
            if (0 < (int)uVar26) {
              uVar19 = 0;
              fVar34 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar17 + uVar19 * 4);
                if (fVar1 <= fVar34) {
                  fVar34 = fVar1;
                }
                uVar19 = uVar19 + 1;
              } while (uVar26 != uVar19);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * (long)pMVar21) = fVar34;
            pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar21 != pMVar22);
        }
      }
      else {
        pMVar21 = (Mat *)(ulong)uVar11;
        bVar25 = (byte)iVar8 >> 1 | bVar14;
        if (reduce_c != false || (bVar25 & 1) != 0) {
          if ((bVar25 & 1) == 0 && bVar28 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)0x1;
            Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar78._8_4_ = (int)lVar24;
                auVar78._0_8_ = lVar24;
                auVar78._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar78 = auVar78 ^ _DAT_003130e0;
                do {
                  auVar161._8_4_ = (int)puVar20;
                  auVar161._0_8_ = puVar20;
                  auVar161._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar161 | auVar68) ^ auVar106;
                  iVar8 = auVar78._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar78._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x7f7fffff;
                  }
                  if ((auVar204._12_4_ != auVar78._12_4_ || auVar204._8_4_ <= auVar78._8_4_) &&
                      auVar204._12_4_ <= auVar78._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar204 = (auVar161 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar78._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x7f7fffff;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    pvVar30 = pvVar17;
                    do {
                      auVar124 = ZEXT816(0x7f7fffff);
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        auVar124 = ZEXT816(0x7f7fffff);
                        do {
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          if (fVar34 <= auVar124._0_4_) {
                            auVar124._0_4_ = fVar34;
                          }
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      *(int *)((long)mins.data +
                              uVar12 * 4 +
                              CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep *
                              (long)pMVar29) = auVar124._0_4_;
                      uVar12 = uVar12 + 1;
                      pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                    } while (uVar12 != uVar19);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar11 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar11) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar11 - 1;
                auVar79._8_4_ = (int)lVar27;
                auVar79._0_8_ = lVar27;
                auVar79._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar12 = 0;
                auVar79 = auVar79 ^ _DAT_003130e0;
                do {
                  auVar162._8_4_ = (int)uVar12;
                  auVar162._0_8_ = uVar12;
                  auVar162._12_4_ = (int)(uVar12 >> 0x20);
                  auVar204 = (auVar162 | auVar68) ^ auVar106;
                  iVar8 = auVar79._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar79._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0x7f7fffff;
                  }
                  if ((auVar204._12_4_ != auVar79._12_4_ || auVar204._8_4_ <= auVar79._8_4_) &&
                      auVar204._12_4_ <= auVar79._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar204 = (auVar162 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar79._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) = 0x7f7fffff
                    ;
                  }
                  uVar12 = uVar12 + 4;
                } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar30 + uVar12 * 4);
                      fVar34 = *(float *)((long)pvVar17 + uVar12 * 4);
                      if (fVar34 <= fVar1) {
                        fVar1 = fVar34;
                      }
                      *(float *)((long)pvVar17 + uVar12 * 4) = fVar1;
                      uVar12 = uVar12 + 1;
                    } while (uVar19 != uVar12);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
          else {
            bVar25 = (byte)iVar8 | bVar15;
            if ((bVar25 & 1) != 0 || bVar28 != 0) {
              if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                Mat::create(top_blob,uVar11,uVar10,1,sVar2,opt->blob_allocator);
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  pvVar17 = top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar101._8_4_ = (int)lVar27;
                  auVar101._0_8_ = lVar27;
                  auVar101._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar101 = auVar101 ^ _DAT_003130e0;
                  do {
                    auVar186._8_4_ = (int)uVar19;
                    auVar186._0_8_ = uVar19;
                    auVar186._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar186 | auVar68) ^ auVar106;
                    iVar8 = auVar101._4_4_;
                    iVar201 = auVar101._12_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar101._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x7f7fffff;
                    }
                    if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar101._8_4_) &&
                        auVar204._12_4_ <= iVar201) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar204 = (auVar186 | auVar75) ^ auVar106;
                    auVar213._0_4_ = -(uint)(auVar101._0_4_ < auVar204._0_4_);
                    auVar213._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                    auVar213._8_4_ = -(uint)(auVar101._8_4_ < auVar204._8_4_);
                    auVar213._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                    iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                    iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                    auVar228._4_4_ = iVar8;
                    auVar228._0_4_ = iVar8;
                    auVar228._8_4_ = iVar201;
                    auVar228._12_4_ = iVar201;
                    auVar187._4_4_ = auVar213._4_4_;
                    auVar187._0_4_ = auVar213._4_4_;
                    auVar187._8_4_ = auVar213._12_4_;
                    auVar187._12_4_ = auVar213._12_4_;
                    auVar188._8_4_ = 0xffffffff;
                    auVar188._0_8_ = 0xffffffffffffffff;
                    auVar188._12_4_ = 0xffffffff;
                    auVar188 = (auVar187 | auVar228 & auVar213) ^ auVar188;
                    if ((auVar188 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar21 = (Mat *)(ulong)auVar188._8_2_;
                    if ((auVar188 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                }
                puVar20 = (uint *)pMVar21;
                if (0 < (int)uVar9) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar17 = bottom_blob->data;
                  pvVar30 = top_blob->data;
                  puVar20 = (uint *)(ulong)uVar26;
                  pMVar21 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar26) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                        fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        if (fVar34 <= fVar1) {
                          fVar1 = fVar34;
                        }
                        *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while ((Mat *)puVar20 != pMVar29);
                    }
                    pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                  } while (pMVar21 != pMVar22);
                }
              }
              else {
                puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                if (reduce_c == false && (bVar25 & 1) == 0) {
                  puVar20 = (uint *)(ulong)uVar11;
                  Mat::create(top_blob,uVar11,1,uVar9,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  sVar2 = top_blob->cstep;
                  uVar26 = top_blob->c * (int)sVar2;
                  if (0 < (int)uVar26) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar26 - 1;
                    auVar52._8_4_ = (int)lVar27;
                    auVar52._0_8_ = lVar27;
                    auVar52._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    puVar20 = (uint *)0x0;
                    auVar52 = auVar52 ^ _DAT_003130e0;
                    do {
                      auVar139._8_4_ = (int)puVar20;
                      auVar139._0_8_ = puVar20;
                      auVar139._12_4_ = (int)((ulong)puVar20 >> 0x20);
                      auVar204 = (auVar139 | auVar68) ^ auVar106;
                      iVar8 = auVar52._4_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar52._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4) = 0x7f7fffff;
                      }
                      if ((auVar204._12_4_ != auVar52._12_4_ || auVar204._8_4_ <= auVar52._8_4_) &&
                          auVar204._12_4_ <= auVar52._12_4_) {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar204 = (auVar139 | auVar75) ^ auVar106;
                      iVar201 = auVar204._4_4_;
                      if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar52._0_4_))
                      {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 8) = 0x7f7fffff;
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 0xc) = 0x7f7fffff;
                      }
                      puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                    } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                  }
                  if (0 < (int)uVar9) {
                    pvVar17 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    puVar20 = (uint *)top_blob->data;
                    sVar5 = bottom_blob->cstep;
                    sVar4 = top_blob->elemsize;
                    pMVar29 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        uVar9 = 0;
                        pvVar30 = pvVar17;
                        do {
                          if (0 < (int)uVar11) {
                            pMVar16 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                              fVar34 = *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4)
                              ;
                              if (fVar34 <= fVar1) {
                                fVar1 = fVar34;
                              }
                              *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4) = fVar1;
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            } while (pMVar21 != pMVar16);
                          }
                          uVar9 = uVar9 + 1;
                          pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar11 * 4);
                        } while (uVar9 != uVar10);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar3 * sVar5);
                      puVar20 = (uint *)((long)&((Mat *)puVar20)->data + sVar2 * sVar4);
                    } while (pMVar29 != pMVar22);
                  }
                }
              }
              break;
            }
            Mat::create(top_blob,uVar11,1,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)(ulong)uVar11;
            Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar90._8_4_ = (int)lVar24;
                auVar90._0_8_ = lVar24;
                auVar90._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar90 = auVar90 ^ _DAT_003130e0;
                do {
                  auVar173._8_4_ = (int)puVar20;
                  auVar173._0_8_ = puVar20;
                  auVar173._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar173 | auVar68) ^ auVar106;
                  iVar8 = auVar90._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar90._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x7f7fffff;
                  }
                  if ((auVar204._12_4_ != auVar90._12_4_ || auVar204._8_4_ <= auVar90._8_4_) &&
                      auVar204._12_4_ <= auVar90._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar204 = (auVar173 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar90._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x7f7fffff;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x7f7fffff;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar26 = 0;
                    pvVar31 = pvVar17;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                          fVar34 = *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          if (fVar34 <= fVar1) {
                            fVar1 = fVar34;
                          }
                          *(float *)((long)pvVar30 + (long)pMVar16 * 4) = fVar1;
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      uVar26 = uVar26 + 1;
                      pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                    } while (uVar26 != uVar10);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  pvVar30 = (void *)((long)pvVar30 +
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                    mins.cstep);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar10 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar10) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar10 - 1;
                auVar91._8_4_ = (int)lVar27;
                auVar91._0_8_ = lVar27;
                auVar91._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar19 = 0;
                auVar91 = auVar91 ^ _DAT_003130e0;
                do {
                  auVar174._8_4_ = (int)uVar19;
                  auVar174._0_8_ = uVar19;
                  auVar174._12_4_ = (int)(uVar19 >> 0x20);
                  auVar204 = (auVar174 | auVar68) ^ auVar106;
                  iVar8 = auVar91._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar91._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0x7f7fffff;
                  }
                  if ((auVar204._12_4_ != auVar91._12_4_ || auVar204._8_4_ <= auVar91._8_4_) &&
                      auVar204._12_4_ <= auVar91._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0x7f7fffff;
                  }
                  auVar204 = (auVar174 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar91._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0x7f7fffff;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) = 0x7f7fffff
                    ;
                  }
                  uVar19 = uVar19 + 4;
                } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar29 = (Mat *)0x0;
                    do {
                      fVar1 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                      fVar34 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                      if (fVar34 <= fVar1) {
                        fVar1 = fVar34;
                      }
                      *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar1;
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    } while (pMVar21 != pMVar29);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
LAB_002001f8:
          Mat::~Mat(&mins);
          goto joined_r0x002005a8;
        }
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar29 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              uVar12 = 0;
              pvVar31 = pvVar17;
              do {
                auVar118 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar11) {
                  pMVar16 = (Mat *)0x0;
                  auVar118 = ZEXT816(0x7f7fffff);
                  do {
                    fVar34 = *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                    if (fVar34 <= auVar118._0_4_) {
                      auVar118._0_4_ = fVar34;
                    }
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar21 != pMVar16);
                }
                *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                     auVar118._0_4_;
                uVar12 = uVar12 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
              } while (uVar12 != uVar19);
            }
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar29 != pMVar22);
        }
      }
    }
    else if (uVar11 == 2) {
      uVar11 = bottom_blob->w;
      pMVar21 = (Mat *)(ulong)uVar11;
      uVar10 = bottom_blob->h;
      pMVar22 = (Mat *)(ulong)uVar10;
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar44._0_8_ = SUB168(auVar43 ^ auVar106,0) << 0x3f;
      auVar44._8_8_ = SUB168(auVar43 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar44);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar10 < 1) {
            fVar34 = 3.4028235e+38;
          }
          else {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = 3.4028235e+38;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  if (fVar1 <= fVar34) {
                    fVar34 = fVar1;
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
            fVar34 = 3.4028235e+38;
            pMVar21 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)mins.data + (long)pMVar21 * 4);
              if (fVar1 <= fVar34) {
                fVar34 = fVar1;
              }
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feea1;
            (*(mins.allocator)->_vptr_Allocator[3])();
          }
        }
        goto joined_r0x002005a8;
      }
      if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        if (0 < (int)uVar10) {
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar17 = bottom_blob->data;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            fVar34 = 3.4028235e+38;
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              fVar34 = 3.4028235e+38;
              do {
                fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                if (fVar1 <= fVar34) {
                  fVar34 = fVar1;
                }
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
      else if (((bVar15 | (byte)iVar8) & 1) == 0) {
        puVar20 = (uint *)pMVar21;
        Mat::create(top_blob,uVar11,1,sVar2,opt->blob_allocator);
        auVar68 = _DAT_003136b0;
        auVar75 = _DAT_003136a0;
        auVar106 = _DAT_003130e0;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar17 = top_blob->data;
          lVar27 = (ulong)uVar9 - 1;
          auVar45._8_4_ = (int)lVar27;
          auVar45._0_8_ = lVar27;
          auVar45._12_4_ = (int)((ulong)lVar27 >> 0x20);
          uVar19 = 0;
          auVar45 = auVar45 ^ _DAT_003130e0;
          do {
            auVar133._8_4_ = (int)uVar19;
            auVar133._0_8_ = uVar19;
            auVar133._12_4_ = (int)(uVar19 >> 0x20);
            auVar204 = (auVar133 | auVar68) ^ auVar106;
            iVar8 = auVar45._4_4_;
            iVar201 = auVar45._12_4_;
            if ((bool)(~(auVar204._4_4_ == iVar8 && auVar45._0_4_ < auVar204._0_4_ ||
                        iVar8 < auVar204._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x7f7fffff;
            }
            if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar45._8_4_) &&
                auVar204._12_4_ <= iVar201) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x7f7fffff;
            }
            auVar204 = (auVar133 | auVar75) ^ auVar106;
            auVar203._0_4_ = -(uint)(auVar45._0_4_ < auVar204._0_4_);
            auVar203._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
            auVar203._8_4_ = -(uint)(auVar45._8_4_ < auVar204._8_4_);
            auVar203._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
            iVar8 = -(uint)(auVar204._4_4_ == iVar8);
            iVar201 = -(uint)(auVar204._12_4_ == iVar201);
            auVar219._4_4_ = iVar8;
            auVar219._0_4_ = iVar8;
            auVar219._8_4_ = iVar201;
            auVar219._12_4_ = iVar201;
            auVar134._4_4_ = auVar203._4_4_;
            auVar134._0_4_ = auVar203._4_4_;
            auVar134._8_4_ = auVar203._12_4_;
            auVar134._12_4_ = auVar203._12_4_;
            auVar135._8_4_ = 0xffffffff;
            auVar135._0_8_ = 0xffffffffffffffff;
            auVar135._12_4_ = 0xffffffff;
            auVar135 = (auVar134 | auVar219 & auVar203) ^ auVar135;
            if ((auVar135 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x7f7fffff;
            }
            puVar20 = (uint *)(ulong)auVar135._8_2_;
            if ((auVar135 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar10) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                fVar34 = *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                if (fVar34 <= fVar1) {
                  fVar1 = fVar34;
                }
                *(float *)((long)pvVar30 + (long)pMVar29 * 4) = fVar1;
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
    }
    else if (uVar11 == 1) {
      iVar8 = bottom_blob->w;
      puVar20 = (uint *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar8 < 1) {
LAB_001faf93:
        fVar34 = 3.4028235e+38;
      }
      else {
        fVar34 = 3.4028235e+38;
        lVar27 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar27 * 4);
          if (fVar1 <= fVar34) {
            fVar34 = fVar1;
          }
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
      }
LAB_001fafa0:
      *(float *)top_blob->data = fVar34;
    }
    break;
  case 6:
    fVar33 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar11 == 3) {
        uVar11 = bottom_blob->w;
        lVar27 = (long)(int)uVar11;
        uVar10 = bottom_blob->h;
        uVar19 = (ulong)uVar10;
        uVar9 = bottom_blob->c;
        pMVar22 = (Mat *)(ulong)uVar9;
        uVar26 = uVar10 * uVar11;
        auVar72._8_4_ = 0xffffffff;
        auVar72._0_8_ = 0xffffffffffffffff;
        auVar72._12_4_ = 0xffffffff;
        auVar73._0_8_ = SUB168(auVar72 ^ auVar106,0) << 0x3f;
        auVar73._8_8_ = SUB168(auVar72 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(3,auVar73);
        bVar28 = reduce_c ^ 1;
        puVar20 = (uint *)pMVar22;
        if (iVar8 == 0 && bVar28 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar9 < 1) {
              fVar34 = 1.0;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar17 = bottom_blob->data;
              puVar20 = (uint *)(ulong)uVar26;
              pMVar21 = (Mat *)0x0;
              do {
                fVar34 = 1.0;
                if (0 < (int)uVar26) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = 1.0;
                  do {
                    fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while ((Mat *)puVar20 != pMVar29);
                }
                *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              } while (pMVar21 != pMVar22);
              fVar34 = 1.0;
              pMVar21 = (Mat *)0x0;
              do {
                fVar34 = fVar34 * *(float *)((long)mins.data + (long)pMVar21 * 4);
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feeb7;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto joined_r0x002005a8;
        }
        if (iVar8 == 0 && reduce_c == false) {
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar30 = top_blob->data;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = 1.0;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 1.0;
                do {
                  fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)(ulong)uVar26 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              puVar20 = (uint *)(ulong)uVar26;
            } while (pMVar21 != pMVar22);
          }
        }
        else {
          pMVar21 = (Mat *)(ulong)uVar11;
          bVar25 = (byte)iVar8 >> 1 | bVar14;
          if (reduce_c != false || (bVar25 & 1) != 0) {
            if ((bVar25 & 1) == 0 && bVar28 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)0x1;
              Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar86._8_4_ = (int)lVar24;
                  auVar86._0_8_ = lVar24;
                  auVar86._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar86 = auVar86 ^ _DAT_003130e0;
                  do {
                    auVar169._8_4_ = (int)puVar20;
                    auVar169._0_8_ = puVar20;
                    auVar169._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar169 | auVar68) ^ auVar106;
                    iVar8 = auVar86._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar86._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x3f800000;
                    }
                    if ((auVar204._12_4_ != auVar86._12_4_ || auVar204._8_4_ <= auVar86._8_4_) &&
                        auVar204._12_4_ <= auVar86._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x3f800000;
                    }
                    auVar204 = (auVar169 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar86._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x3f800000;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x3f800000;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      pvVar30 = pvVar17;
                      do {
                        auVar128 = ZEXT816(0x3f800000);
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          auVar128 = ZEXT816(0x3f800000);
                          do {
                            auVar128._0_4_ =
                                 auVar128._0_4_ * *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        *(int *)((long)mins.data +
                                uVar12 * 4 +
                                CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep
                                * (long)pMVar29) = auVar128._0_4_;
                        uVar12 = uVar12 + 1;
                        pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                      } while (uVar12 != uVar19);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar87._8_4_ = (int)lVar27;
                  auVar87._0_8_ = lVar27;
                  auVar87._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar12 = 0;
                  auVar87 = auVar87 ^ _DAT_003130e0;
                  do {
                    auVar170._8_4_ = (int)uVar12;
                    auVar170._0_8_ = uVar12;
                    auVar170._12_4_ = (int)(uVar12 >> 0x20);
                    auVar204 = (auVar170 | auVar68) ^ auVar106;
                    iVar8 = auVar87._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar87._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0x3f800000;
                    }
                    if ((auVar204._12_4_ != auVar87._12_4_ || auVar204._8_4_ <= auVar87._8_4_) &&
                        auVar204._12_4_ <= auVar87._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0x3f800000;
                    }
                    auVar204 = (auVar170 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar87._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) =
                           0x3f800000;
                    }
                    uVar12 = uVar12 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar12 = 0;
                      do {
                        *(float *)((long)pvVar17 + uVar12 * 4) =
                             *(float *)((long)pvVar30 + uVar12 * 4) *
                             *(float *)((long)pvVar17 + uVar12 * 4);
                        uVar12 = uVar12 + 1;
                      } while (uVar19 != uVar12);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            else {
              bVar25 = (byte)iVar8 | bVar15;
              if ((bVar25 & 1) != 0 || bVar28 != 0) {
                if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                  Mat::create(top_blob,uVar11,uVar10,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar11) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar11 - 1;
                    auVar105._8_4_ = (int)lVar27;
                    auVar105._0_8_ = lVar27;
                    auVar105._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    uVar19 = 0;
                    auVar105 = auVar105 ^ _DAT_003130e0;
                    do {
                      auVar198._8_4_ = (int)uVar19;
                      auVar198._0_8_ = uVar19;
                      auVar198._12_4_ = (int)(uVar19 >> 0x20);
                      auVar204 = (auVar198 | auVar68) ^ auVar106;
                      iVar8 = auVar105._4_4_;
                      iVar201 = auVar105._12_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar105._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x3f800000;
                      }
                      if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar105._8_4_) &&
                          auVar204._12_4_ <= iVar201) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x3f800000;
                      }
                      auVar204 = (auVar198 | auVar75) ^ auVar106;
                      auVar217._0_4_ = -(uint)(auVar105._0_4_ < auVar204._0_4_);
                      auVar217._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                      auVar217._8_4_ = -(uint)(auVar105._8_4_ < auVar204._8_4_);
                      auVar217._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                      iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                      iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                      auVar232._4_4_ = iVar8;
                      auVar232._0_4_ = iVar8;
                      auVar232._8_4_ = iVar201;
                      auVar232._12_4_ = iVar201;
                      auVar199._4_4_ = auVar217._4_4_;
                      auVar199._0_4_ = auVar217._4_4_;
                      auVar199._8_4_ = auVar217._12_4_;
                      auVar199._12_4_ = auVar217._12_4_;
                      auVar200._8_4_ = 0xffffffff;
                      auVar200._0_8_ = 0xffffffffffffffff;
                      auVar200._12_4_ = 0xffffffff;
                      auVar200 = (auVar199 | auVar232 & auVar217) ^ auVar200;
                      if ((auVar200 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x3f800000;
                      }
                      pMVar21 = (Mat *)(ulong)auVar200._8_2_;
                      if ((auVar200 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar19 = uVar19 + 4;
                    } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                  }
                  puVar20 = (uint *)pMVar21;
                  if (0 < (int)uVar9) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar17 = bottom_blob->data;
                    pvVar30 = top_blob->data;
                    pMVar21 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar26) {
                        pMVar29 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar30 + (long)pMVar29 * 4) =
                               *(float *)((long)pvVar17 + (long)pMVar29 * 4) *
                               *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                          pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        } while ((Mat *)(ulong)uVar26 != pMVar29);
                      }
                      pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                      puVar20 = (uint *)(ulong)uVar26;
                    } while (pMVar21 != pMVar22);
                  }
                }
                else {
                  puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                  if (reduce_c == false && (bVar25 & 1) == 0) {
                    puVar20 = (uint *)(ulong)uVar11;
                    Mat::create(top_blob,uVar11,uVar9,sVar2,opt->blob_allocator);
                    auVar68 = _DAT_003136b0;
                    auVar75 = _DAT_003136a0;
                    auVar106 = _DAT_003130e0;
                    uVar26 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar26) {
                      pvVar17 = top_blob->data;
                      lVar27 = (ulong)uVar26 - 1;
                      auVar74._8_4_ = (int)lVar27;
                      auVar74._0_8_ = lVar27;
                      auVar74._12_4_ = (int)((ulong)lVar27 >> 0x20);
                      uVar19 = 0;
                      auVar74 = auVar74 ^ _DAT_003130e0;
                      do {
                        auVar156._8_4_ = (int)uVar19;
                        auVar156._0_8_ = uVar19;
                        auVar156._12_4_ = (int)(uVar19 >> 0x20);
                        auVar204 = (auVar156 | auVar68) ^ auVar106;
                        iVar8 = auVar74._4_4_;
                        iVar201 = auVar74._12_4_;
                        if ((bool)(~(auVar204._4_4_ == iVar8 && auVar74._0_4_ < auVar204._0_4_ ||
                                    iVar8 < auVar204._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x3f800000;
                        }
                        if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar74._8_4_) &&
                            auVar204._12_4_ <= iVar201) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x3f800000;
                        }
                        auVar204 = (auVar156 | auVar75) ^ auVar106;
                        auVar211._0_4_ = -(uint)(auVar74._0_4_ < auVar204._0_4_);
                        auVar211._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                        auVar211._8_4_ = -(uint)(auVar74._8_4_ < auVar204._8_4_);
                        auVar211._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                        iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                        iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                        auVar226._4_4_ = iVar8;
                        auVar226._0_4_ = iVar8;
                        auVar226._8_4_ = iVar201;
                        auVar226._12_4_ = iVar201;
                        auVar157._4_4_ = auVar211._4_4_;
                        auVar157._0_4_ = auVar211._4_4_;
                        auVar157._8_4_ = auVar211._12_4_;
                        auVar157._12_4_ = auVar211._12_4_;
                        auVar158._8_4_ = 0xffffffff;
                        auVar158._0_8_ = 0xffffffffffffffff;
                        auVar158._12_4_ = 0xffffffff;
                        auVar158 = (auVar157 | auVar226 & auVar211) ^ auVar158;
                        if ((auVar158 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x3f800000;
                        }
                        puVar20 = (uint *)(ulong)auVar158._8_2_;
                        if ((auVar158 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x3f800000;
                        }
                        uVar19 = uVar19 + 4;
                      } while ((uVar26 + 3 & 0xfffffffc) != uVar19);
                    }
                    if (0 < (int)uVar9) {
                      pvVar17 = bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      pvVar30 = top_blob->data;
                      sVar3 = bottom_blob->cstep;
                      puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
                      pMVar29 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar10) {
                          uVar9 = 0;
                          pvVar31 = pvVar17;
                          do {
                            if (0 < (int)uVar11) {
                              pMVar16 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar30 + (long)pMVar16 * 4) =
                                     *(float *)((long)pvVar31 + (long)pMVar16 * 4) *
                                     *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                              } while (pMVar21 != pMVar16);
                            }
                            uVar9 = uVar9 + 1;
                            pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar11 * 4);
                          } while (uVar9 != uVar10);
                        }
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                        pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                        pvVar30 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar30);
                      } while (pMVar29 != pMVar22);
                    }
                  }
                }
                break;
              }
              Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)(ulong)uVar11;
              Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  lVar24 = (ulong)uVar26 - 1;
                  auVar98._8_4_ = (int)lVar24;
                  auVar98._0_8_ = lVar24;
                  auVar98._12_4_ = (int)((ulong)lVar24 >> 0x20);
                  puVar20 = (uint *)0x0;
                  auVar98 = auVar98 ^ _DAT_003130e0;
                  do {
                    auVar181._8_4_ = (int)puVar20;
                    auVar181._0_8_ = puVar20;
                    auVar181._12_4_ = (int)((ulong)puVar20 >> 0x20);
                    auVar204 = (auVar181 | auVar68) ^ auVar106;
                    iVar8 = auVar98._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar98._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x3f800000;
                    }
                    if ((auVar204._12_4_ != auVar98._12_4_ || auVar204._8_4_ <= auVar98._8_4_) &&
                        auVar204._12_4_ <= auVar98._12_4_) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x3f800000;
                    }
                    auVar204 = (auVar181 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar98._0_4_)) {
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x3f800000;
                      *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x3f800000;
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                  } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = bottom_blob->data;
                  puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                  pMVar29 = (Mat *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar10) {
                      uVar26 = 0;
                      pvVar31 = pvVar17;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar16 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar30 + (long)pMVar16 * 4) =
                                 *(float *)((long)pvVar31 + (long)pMVar16 * 4) *
                                 *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                            pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                          } while (pMVar21 != pMVar16);
                        }
                        uVar26 = uVar26 + 1;
                        pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                      } while (uVar26 != uVar10);
                    }
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                    pvVar30 = (void *)((long)pvVar30 +
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                      mins.cstep);
                  } while (pMVar29 != pMVar22);
                }
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  puVar20 = (uint *)top_blob->data;
                  lVar27 = (ulong)uVar10 - 1;
                  auVar99._8_4_ = (int)lVar27;
                  auVar99._0_8_ = lVar27;
                  auVar99._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar99 = auVar99 ^ _DAT_003130e0;
                  do {
                    auVar182._8_4_ = (int)uVar19;
                    auVar182._0_8_ = uVar19;
                    auVar182._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar182 | auVar68) ^ auVar106;
                    iVar8 = auVar99._4_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar99._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0x3f800000;
                    }
                    if ((auVar204._12_4_ != auVar99._12_4_ || auVar204._8_4_ <= auVar99._8_4_) &&
                        auVar204._12_4_ <= auVar99._12_4_) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0x3f800000;
                    }
                    auVar204 = (auVar182 | auVar75) ^ auVar106;
                    iVar201 = auVar204._4_4_;
                    if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar99._0_4_)) {
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0x3f800000;
                      *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) =
                           0x3f800000;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
                }
                if (0 < (int)uVar9) {
                  pvVar17 = top_blob->data;
                  puVar20 = (uint *)0x0;
                  pvVar30 = mins.data;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar17 + (long)pMVar29 * 4) =
                             *(float *)((long)pvVar30 + (long)pMVar29 * 4) *
                             *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while (pMVar21 != pMVar29);
                    }
                    puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                    pvVar30 = (void *)((long)pvVar30 +
                                      mins.cstep *
                                      CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                  } while ((Mat *)puVar20 != pMVar22);
                }
                iVar8 = 0;
              }
            }
            goto LAB_00200591;
          }
          puVar20 = (uint *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
          if (0 < (int)uVar9) {
            pvVar17 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)((long)top_blob->w * top_blob->elemsize);
            sVar3 = bottom_blob->cstep;
            pMVar29 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar12 = 0;
                pvVar31 = pvVar17;
                do {
                  auVar122 = ZEXT816(0x3f800000);
                  if (0 < (int)uVar11) {
                    pMVar16 = (Mat *)0x0;
                    auVar122 = ZEXT816(0x3f800000);
                    do {
                      auVar122._0_4_ =
                           auVar122._0_4_ * *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar21 != pMVar16);
                  }
                  *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                       auVar122._0_4_;
                  uVar12 = uVar12 + 1;
                  pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                } while (uVar12 != uVar19);
              }
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar29 != pMVar22);
          }
        }
      }
      else if (uVar11 == 2) {
        uVar11 = bottom_blob->w;
        pMVar21 = (Mat *)(ulong)uVar11;
        uVar10 = bottom_blob->h;
        pMVar22 = (Mat *)(ulong)uVar10;
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar66._0_8_ = SUB168(auVar65 ^ auVar106,0) << 0x3f;
        auVar66._8_8_ = SUB168(auVar65 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(uVar13,auVar66);
        if (iVar8 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          puVar20 = (uint *)pMVar22;
          Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
          iVar8 = -100;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar10 < 1) {
              fVar34 = 1.0;
            }
            else {
              pvVar17 = bottom_blob->data;
              iVar8 = bottom_blob->w;
              sVar2 = bottom_blob->elemsize;
              puVar20 = (uint *)0x0;
              do {
                fVar34 = 1.0;
                if (0 < (int)uVar11) {
                  pMVar29 = (Mat *)0x0;
                  fVar34 = 1.0;
                  do {
                    fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                    pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  } while (pMVar21 != pMVar29);
                }
                *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
                puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
              } while ((Mat *)puVar20 != pMVar22);
              fVar34 = 1.0;
              pMVar21 = (Mat *)0x0;
              do {
                fVar34 = fVar34 * *(float *)((long)mins.data + (long)pMVar21 * 4);
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(float *)top_blob->data = fVar34;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feeb7;
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
          goto joined_r0x002005a8;
        }
        if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
          puVar20 = (uint *)pMVar22;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          if (0 < (int)uVar10) {
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar17 = bottom_blob->data;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = 1.0;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 1.0;
                do {
                  fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
        else if (((bVar15 | (byte)iVar8) & 1) == 0) {
          puVar20 = (uint *)pMVar21;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          auVar68 = _DAT_003136b0;
          auVar75 = _DAT_003136a0;
          auVar106 = _DAT_003130e0;
          uVar9 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar9) {
            pvVar17 = top_blob->data;
            lVar27 = (ulong)uVar9 - 1;
            auVar67._8_4_ = (int)lVar27;
            auVar67._0_8_ = lVar27;
            auVar67._12_4_ = (int)((ulong)lVar27 >> 0x20);
            uVar19 = 0;
            auVar67 = auVar67 ^ _DAT_003130e0;
            do {
              auVar150._8_4_ = (int)uVar19;
              auVar150._0_8_ = uVar19;
              auVar150._12_4_ = (int)(uVar19 >> 0x20);
              auVar204 = (auVar150 | auVar68) ^ auVar106;
              iVar8 = auVar67._4_4_;
              iVar201 = auVar67._12_4_;
              if ((bool)(~(auVar204._4_4_ == iVar8 && auVar67._0_4_ < auVar204._0_4_ ||
                          iVar8 < auVar204._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x3f800000;
              }
              if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar67._8_4_) &&
                  auVar204._12_4_ <= iVar201) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x3f800000;
              }
              auVar204 = (auVar150 | auVar75) ^ auVar106;
              auVar209._0_4_ = -(uint)(auVar67._0_4_ < auVar204._0_4_);
              auVar209._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
              auVar209._8_4_ = -(uint)(auVar67._8_4_ < auVar204._8_4_);
              auVar209._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
              iVar8 = -(uint)(auVar204._4_4_ == iVar8);
              iVar201 = -(uint)(auVar204._12_4_ == iVar201);
              auVar224._4_4_ = iVar8;
              auVar224._0_4_ = iVar8;
              auVar224._8_4_ = iVar201;
              auVar224._12_4_ = iVar201;
              auVar151._4_4_ = auVar209._4_4_;
              auVar151._0_4_ = auVar209._4_4_;
              auVar151._8_4_ = auVar209._12_4_;
              auVar151._12_4_ = auVar209._12_4_;
              auVar152._8_4_ = 0xffffffff;
              auVar152._0_8_ = 0xffffffffffffffff;
              auVar152._12_4_ = 0xffffffff;
              auVar152 = (auVar151 | auVar224 & auVar209) ^ auVar152;
              if ((auVar152 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x3f800000;
              }
              puVar20 = (uint *)(ulong)auVar152._8_2_;
              if ((auVar152 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x3f800000;
              }
              uVar19 = uVar19 + 4;
            } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
          }
          if (0 < (int)uVar10) {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            puVar20 = (uint *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar30 + (long)pMVar29 * 4) =
                       *(float *)((long)pvVar17 + (long)pMVar29 * 4) *
                       *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
          }
        }
      }
      else if (uVar11 == 1) {
        iVar8 = bottom_blob->w;
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar8 < 1) goto LAB_001fb1a8;
        fVar34 = 1.0;
        lVar27 = 0;
        do {
          fVar34 = fVar34 * *(float *)((long)bottom_blob->data + lVar27 * 4);
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
        goto LAB_001fb1b5;
      }
    }
    else if (uVar11 == 3) {
      uVar11 = bottom_blob->w;
      lVar27 = (long)(int)uVar11;
      uVar10 = bottom_blob->h;
      uVar19 = (ulong)uVar10;
      uVar9 = bottom_blob->c;
      pMVar22 = (Mat *)(ulong)uVar9;
      uVar26 = uVar10 * uVar11;
      auVar53._8_4_ = 0xffffffff;
      auVar53._0_8_ = 0xffffffffffffffff;
      auVar53._12_4_ = 0xffffffff;
      auVar54._0_8_ = SUB168(auVar53 ^ auVar106,0) << 0x3f;
      auVar54._8_8_ = SUB168(auVar53 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(3,auVar54);
      bVar28 = reduce_c ^ 1;
      if (iVar8 == 0 && bVar28 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar9 < 1) {
            fVar34 = 1.0;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar17 = bottom_blob->data;
            puVar20 = (uint *)(ulong)uVar26;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = 1.0;
              if (0 < (int)uVar26) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 1.0;
                do {
                  fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while ((Mat *)puVar20 != pMVar29);
              }
              *(float *)((long)mins.data + (long)pMVar21 * 4) = fVar34;
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar21 != pMVar22);
            fVar34 = 1.0;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = fVar34 * *(float *)((long)mins.data + (long)pMVar21 * 4);
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) {
joined_r0x001feeb7:
              mins.data = puVar20;
              if ((Mat *)puVar20 != (Mat *)0x0) {
                free(puVar20);
              }
            }
            else {
              (*(mins.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto joined_r0x002005a8;
      }
      if (iVar8 == 0 && reduce_c == false) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,1,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar21 = (Mat *)0x0;
          do {
            fVar34 = 1.0;
            if (0 < (int)uVar26) {
              uVar19 = 0;
              fVar34 = 1.0;
              do {
                fVar34 = fVar34 * *(float *)((long)pvVar17 + uVar19 * 4);
                uVar19 = uVar19 + 1;
              } while (uVar26 != uVar19);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * (long)pMVar21) = fVar34;
            pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar21 != pMVar22);
        }
      }
      else {
        pMVar21 = (Mat *)(ulong)uVar11;
        bVar25 = (byte)iVar8 >> 1 | bVar14;
        if (reduce_c != false || (bVar25 & 1) != 0) {
          if ((bVar25 & 1) == 0 && bVar28 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)0x1;
            Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar80._8_4_ = (int)lVar24;
                auVar80._0_8_ = lVar24;
                auVar80._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar80 = auVar80 ^ _DAT_003130e0;
                do {
                  auVar163._8_4_ = (int)puVar20;
                  auVar163._0_8_ = puVar20;
                  auVar163._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar163 | auVar68) ^ auVar106;
                  iVar8 = auVar80._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar80._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x3f800000;
                  }
                  if ((auVar204._12_4_ != auVar80._12_4_ || auVar204._8_4_ <= auVar80._8_4_) &&
                      auVar204._12_4_ <= auVar80._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x3f800000;
                  }
                  auVar204 = (auVar163 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar80._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x3f800000;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    pvVar30 = pvVar17;
                    do {
                      auVar125 = ZEXT816(0x3f800000);
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        auVar125 = ZEXT816(0x3f800000);
                        do {
                          auVar125._0_4_ =
                               auVar125._0_4_ * *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      *(int *)((long)mins.data +
                              uVar12 * 4 +
                              CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) * mins.cstep *
                              (long)pMVar29) = auVar125._0_4_;
                      uVar12 = uVar12 + 1;
                      pvVar30 = (void *)((long)pvVar30 + lVar27 * 4);
                    } while (uVar12 != uVar19);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar11 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar11) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar11 - 1;
                auVar81._8_4_ = (int)lVar27;
                auVar81._0_8_ = lVar27;
                auVar81._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar12 = 0;
                auVar81 = auVar81 ^ _DAT_003130e0;
                do {
                  auVar164._8_4_ = (int)uVar12;
                  auVar164._0_8_ = uVar12;
                  auVar164._12_4_ = (int)(uVar12 >> 0x20);
                  auVar204 = (auVar164 | auVar68) ^ auVar106;
                  iVar8 = auVar81._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar81._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4) = 0x3f800000;
                  }
                  if ((auVar204._12_4_ != auVar81._12_4_ || auVar204._8_4_ <= auVar81._8_4_) &&
                      auVar204._12_4_ <= auVar81._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar12 * 4 + 4) = 0x3f800000;
                  }
                  auVar204 = (auVar164 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar81._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4) = 0x3f800000;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar12 * 4 + 4) = 0x3f800000
                    ;
                  }
                  uVar12 = uVar12 + 4;
                } while ((uVar11 + 3 & 0xfffffffc) != uVar12);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar12 = 0;
                    do {
                      *(float *)((long)pvVar17 + uVar12 * 4) =
                           *(float *)((long)pvVar30 + uVar12 * 4) *
                           *(float *)((long)pvVar17 + uVar12 * 4);
                      uVar12 = uVar12 + 1;
                    } while (uVar19 != uVar12);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
          else {
            bVar25 = (byte)iVar8 | bVar15;
            if ((bVar25 & 1) != 0 || bVar28 != 0) {
              if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                Mat::create(top_blob,uVar11,uVar10,1,sVar2,opt->blob_allocator);
                auVar68 = _DAT_003136b0;
                auVar75 = _DAT_003136a0;
                auVar106 = _DAT_003130e0;
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  pvVar17 = top_blob->data;
                  lVar27 = (ulong)uVar11 - 1;
                  auVar102._8_4_ = (int)lVar27;
                  auVar102._0_8_ = lVar27;
                  auVar102._12_4_ = (int)((ulong)lVar27 >> 0x20);
                  uVar19 = 0;
                  auVar102 = auVar102 ^ _DAT_003130e0;
                  do {
                    auVar189._8_4_ = (int)uVar19;
                    auVar189._0_8_ = uVar19;
                    auVar189._12_4_ = (int)(uVar19 >> 0x20);
                    auVar204 = (auVar189 | auVar68) ^ auVar106;
                    iVar8 = auVar102._4_4_;
                    iVar201 = auVar102._12_4_;
                    if ((bool)(~(auVar204._4_4_ == iVar8 && auVar102._0_4_ < auVar204._0_4_ ||
                                iVar8 < auVar204._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x3f800000;
                    }
                    if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar102._8_4_) &&
                        auVar204._12_4_ <= iVar201) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x3f800000;
                    }
                    auVar204 = (auVar189 | auVar75) ^ auVar106;
                    auVar214._0_4_ = -(uint)(auVar102._0_4_ < auVar204._0_4_);
                    auVar214._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
                    auVar214._8_4_ = -(uint)(auVar102._8_4_ < auVar204._8_4_);
                    auVar214._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
                    iVar8 = -(uint)(auVar204._4_4_ == iVar8);
                    iVar201 = -(uint)(auVar204._12_4_ == iVar201);
                    auVar229._4_4_ = iVar8;
                    auVar229._0_4_ = iVar8;
                    auVar229._8_4_ = iVar201;
                    auVar229._12_4_ = iVar201;
                    auVar190._4_4_ = auVar214._4_4_;
                    auVar190._0_4_ = auVar214._4_4_;
                    auVar190._8_4_ = auVar214._12_4_;
                    auVar190._12_4_ = auVar214._12_4_;
                    auVar191._8_4_ = 0xffffffff;
                    auVar191._0_8_ = 0xffffffffffffffff;
                    auVar191._12_4_ = 0xffffffff;
                    auVar191 = (auVar190 | auVar229 & auVar214) ^ auVar191;
                    if ((auVar191 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x3f800000;
                    }
                    pMVar21 = (Mat *)(ulong)auVar191._8_2_;
                    if ((auVar191 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar19 = uVar19 + 4;
                  } while ((uVar11 + 3 & 0xfffffffc) != uVar19);
                }
                puVar20 = (uint *)pMVar21;
                if (0 < (int)uVar9) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar17 = bottom_blob->data;
                  pvVar30 = top_blob->data;
                  pMVar21 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar26) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar30 + (long)pMVar29 * 4) =
                             *(float *)((long)pvVar17 + (long)pMVar29 * 4) *
                             *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while ((Mat *)(ulong)uVar26 != pMVar29);
                    }
                    pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                    puVar20 = (uint *)(ulong)uVar26;
                  } while (pMVar21 != pMVar22);
                }
              }
              else {
                puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                if (reduce_c == false && (bVar25 & 1) == 0) {
                  puVar20 = (uint *)(ulong)uVar11;
                  Mat::create(top_blob,uVar11,1,uVar9,sVar2,opt->blob_allocator);
                  auVar68 = _DAT_003136b0;
                  auVar75 = _DAT_003136a0;
                  auVar106 = _DAT_003130e0;
                  sVar2 = top_blob->cstep;
                  uVar26 = top_blob->c * (int)sVar2;
                  if (0 < (int)uVar26) {
                    pvVar17 = top_blob->data;
                    lVar27 = (ulong)uVar26 - 1;
                    auVar55._8_4_ = (int)lVar27;
                    auVar55._0_8_ = lVar27;
                    auVar55._12_4_ = (int)((ulong)lVar27 >> 0x20);
                    puVar20 = (uint *)0x0;
                    auVar55 = auVar55 ^ _DAT_003130e0;
                    do {
                      auVar140._8_4_ = (int)puVar20;
                      auVar140._0_8_ = puVar20;
                      auVar140._12_4_ = (int)((ulong)puVar20 >> 0x20);
                      auVar204 = (auVar140 | auVar68) ^ auVar106;
                      iVar8 = auVar55._4_4_;
                      if ((bool)(~(auVar204._4_4_ == iVar8 && auVar55._0_4_ < auVar204._0_4_ ||
                                  iVar8 < auVar204._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4) = 0x3f800000;
                      }
                      if ((auVar204._12_4_ != auVar55._12_4_ || auVar204._8_4_ <= auVar55._8_4_) &&
                          auVar204._12_4_ <= auVar55._12_4_) {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 4) = 0x3f800000;
                      }
                      auVar204 = (auVar140 | auVar75) ^ auVar106;
                      iVar201 = auVar204._4_4_;
                      if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar55._0_4_))
                      {
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 8) = 0x3f800000;
                        *(undefined4 *)((long)pvVar17 + (long)puVar20 * 4 + 0xc) = 0x3f800000;
                      }
                      puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                    } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
                  }
                  if (0 < (int)uVar9) {
                    pvVar17 = bottom_blob->data;
                    sVar3 = bottom_blob->elemsize;
                    puVar20 = (uint *)top_blob->data;
                    sVar5 = bottom_blob->cstep;
                    sVar4 = top_blob->elemsize;
                    pMVar29 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        uVar9 = 0;
                        pvVar30 = pvVar17;
                        do {
                          if (0 < (int)uVar11) {
                            pMVar16 = (Mat *)0x0;
                            do {
                              *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4) =
                                   *(float *)((long)pvVar30 + (long)pMVar16 * 4) *
                                   *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar16 * 4);
                              pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                            } while (pMVar21 != pMVar16);
                          }
                          uVar9 = uVar9 + 1;
                          pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar11 * 4);
                        } while (uVar9 != uVar10);
                      }
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar3 * sVar5);
                      puVar20 = (uint *)((long)&((Mat *)puVar20)->data + sVar2 * sVar4);
                    } while (pMVar29 != pMVar22);
                  }
                }
              }
              break;
            }
            Mat::create(top_blob,uVar11,1,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)(ulong)uVar11;
            Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
            auVar68 = _DAT_003136b0;
            auVar75 = _DAT_003136a0;
            auVar106 = _DAT_003130e0;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) &&
               (puVar20 = (uint *)(long)mins.c, mins.cstep * (long)puVar20 != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                lVar24 = (ulong)uVar26 - 1;
                auVar92._8_4_ = (int)lVar24;
                auVar92._0_8_ = lVar24;
                auVar92._12_4_ = (int)((ulong)lVar24 >> 0x20);
                puVar20 = (uint *)0x0;
                auVar92 = auVar92 ^ _DAT_003130e0;
                do {
                  auVar175._8_4_ = (int)puVar20;
                  auVar175._0_8_ = puVar20;
                  auVar175._12_4_ = (int)((ulong)puVar20 >> 0x20);
                  auVar204 = (auVar175 | auVar68) ^ auVar106;
                  iVar8 = auVar92._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar92._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4) = 0x3f800000;
                  }
                  if ((auVar204._12_4_ != auVar92._12_4_ || auVar204._8_4_ <= auVar92._8_4_) &&
                      auVar204._12_4_ <= auVar92._12_4_) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 4) = 0x3f800000;
                  }
                  auVar204 = (auVar175 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar92._0_4_)) {
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 8) = 0x3f800000;
                    *(undefined4 *)((long)mins.data + (long)puVar20 * 4 + 0xc) = 0x3f800000;
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 4);
                } while ((Mat *)(ulong)(uVar26 + 3 & 0xfffffffc) != (Mat *)puVar20);
              }
              if (0 < (int)uVar9) {
                pvVar17 = bottom_blob->data;
                puVar20 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
                pMVar29 = (Mat *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar10) {
                    uVar26 = 0;
                    pvVar31 = pvVar17;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar16 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar30 + (long)pMVar16 * 4) =
                               *(float *)((long)pvVar31 + (long)pMVar16 * 4) *
                               *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                          pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                        } while (pMVar21 != pMVar16);
                      }
                      uVar26 = uVar26 + 1;
                      pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
                    } while (uVar26 != uVar10);
                  }
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                  pvVar17 = (void *)((long)&((Mat *)puVar20)->data + (long)pvVar17);
                  pvVar30 = (void *)((long)pvVar30 +
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize) *
                                    mins.cstep);
                } while (pMVar29 != pMVar22);
              }
              auVar68 = _DAT_003136b0;
              auVar75 = _DAT_003136a0;
              auVar106 = _DAT_003130e0;
              uVar10 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar10) {
                puVar20 = (uint *)top_blob->data;
                lVar27 = (ulong)uVar10 - 1;
                auVar93._8_4_ = (int)lVar27;
                auVar93._0_8_ = lVar27;
                auVar93._12_4_ = (int)((ulong)lVar27 >> 0x20);
                uVar19 = 0;
                auVar93 = auVar93 ^ _DAT_003130e0;
                do {
                  auVar176._8_4_ = (int)uVar19;
                  auVar176._0_8_ = uVar19;
                  auVar176._12_4_ = (int)(uVar19 >> 0x20);
                  auVar204 = (auVar176 | auVar68) ^ auVar106;
                  iVar8 = auVar93._4_4_;
                  if ((bool)(~(auVar204._4_4_ == iVar8 && auVar93._0_4_ < auVar204._0_4_ ||
                              iVar8 < auVar204._4_4_) & 1)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4) = 0x3f800000;
                  }
                  if ((auVar204._12_4_ != auVar93._12_4_ || auVar204._8_4_ <= auVar93._8_4_) &&
                      auVar204._12_4_ <= auVar93._12_4_) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->data + uVar19 * 4 + 4) = 0x3f800000;
                  }
                  auVar204 = (auVar176 | auVar75) ^ auVar106;
                  iVar201 = auVar204._4_4_;
                  if (iVar201 <= iVar8 && (iVar201 != iVar8 || auVar204._0_4_ <= auVar93._0_4_)) {
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4) = 0x3f800000;
                    *(undefined4 *)((long)&((Mat *)puVar20)->refcount + uVar19 * 4 + 4) = 0x3f800000
                    ;
                  }
                  uVar19 = uVar19 + 4;
                } while ((uVar10 + 3 & 0xfffffffc) != uVar19);
              }
              if (0 < (int)uVar9) {
                pvVar17 = top_blob->data;
                puVar20 = (uint *)0x0;
                pvVar30 = mins.data;
                do {
                  if (0 < (int)uVar11) {
                    pMVar29 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar17 + (long)pMVar29 * 4) =
                           *(float *)((long)pvVar30 + (long)pMVar29 * 4) *
                           *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                      pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                    } while (pMVar21 != pMVar29);
                  }
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
                  pvVar30 = (void *)((long)pvVar30 +
                                    mins.cstep *
                                    CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize));
                } while ((Mat *)puVar20 != pMVar22);
              }
              iVar8 = 0;
            }
          }
LAB_00200591:
          Mat::~Mat(&mins);
          goto joined_r0x002005a8;
        }
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,uVar9,sVar2,opt->blob_allocator);
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pMVar29 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              uVar12 = 0;
              pvVar31 = pvVar17;
              do {
                auVar119 = ZEXT816(0x3f800000);
                if (0 < (int)uVar11) {
                  pMVar16 = (Mat *)0x0;
                  auVar119 = ZEXT816(0x3f800000);
                  do {
                    auVar119._0_4_ = auVar119._0_4_ * *(float *)((long)pvVar31 + (long)pMVar16 * 4);
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar21 != pMVar16);
                }
                *(int *)((long)pvVar30 + uVar12 * 4 + (long)puVar20 * (long)pMVar29) =
                     auVar119._0_4_;
                uVar12 = uVar12 + 1;
                pvVar31 = (void *)((long)pvVar31 + lVar27 * 4);
              } while (uVar12 != uVar19);
            }
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
          } while (pMVar29 != pMVar22);
        }
      }
    }
    else if (uVar11 == 2) {
      uVar11 = bottom_blob->w;
      pMVar21 = (Mat *)(ulong)uVar11;
      uVar10 = bottom_blob->h;
      pMVar22 = (Mat *)(ulong)uVar10;
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar47._0_8_ = SUB168(auVar46 ^ auVar106,0) << 0x3f;
      auVar47._8_8_ = SUB168(auVar46 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(uVar13,auVar47);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
        iVar8 = -100;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar10 < 1) {
            fVar34 = 1.0;
          }
          else {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            puVar20 = (uint *)0x0;
            do {
              fVar34 = 1.0;
              if (0 < (int)uVar11) {
                pMVar29 = (Mat *)0x0;
                fVar34 = 1.0;
                do {
                  fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                  pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                } while (pMVar21 != pMVar29);
              }
              *(float *)((long)mins.data + (long)puVar20 * 4) = fVar34;
              puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while ((Mat *)puVar20 != pMVar22);
            fVar34 = 1.0;
            pMVar21 = (Mat *)0x0;
            do {
              fVar34 = fVar34 * *(float *)((long)mins.data + (long)pMVar21 * 4);
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(float *)top_blob->data = fVar34;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feeb7;
            (*(mins.allocator)->_vptr_Allocator[3])();
          }
        }
        goto joined_r0x002005a8;
      }
      if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        if (0 < (int)uVar10) {
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar17 = bottom_blob->data;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            fVar34 = 1.0;
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              fVar34 = 1.0;
              do {
                fVar34 = fVar34 * *(float *)((long)pvVar17 + (long)pMVar29 * 4);
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            *(float *)((long)pvVar30 + (long)puVar20 * 4) = fVar34;
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
      else if (((bVar15 | (byte)iVar8) & 1) == 0) {
        puVar20 = (uint *)pMVar21;
        Mat::create(top_blob,uVar11,1,sVar2,opt->blob_allocator);
        auVar68 = _DAT_003136b0;
        auVar75 = _DAT_003136a0;
        auVar106 = _DAT_003130e0;
        uVar9 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar9) {
          pvVar17 = top_blob->data;
          lVar27 = (ulong)uVar9 - 1;
          auVar48._8_4_ = (int)lVar27;
          auVar48._0_8_ = lVar27;
          auVar48._12_4_ = (int)((ulong)lVar27 >> 0x20);
          uVar19 = 0;
          auVar48 = auVar48 ^ _DAT_003130e0;
          do {
            auVar136._8_4_ = (int)uVar19;
            auVar136._0_8_ = uVar19;
            auVar136._12_4_ = (int)(uVar19 >> 0x20);
            auVar204 = (auVar136 | auVar68) ^ auVar106;
            iVar8 = auVar48._4_4_;
            iVar201 = auVar48._12_4_;
            if ((bool)(~(auVar204._4_4_ == iVar8 && auVar48._0_4_ < auVar204._0_4_ ||
                        iVar8 < auVar204._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4) = 0x3f800000;
            }
            if ((auVar204._12_4_ != iVar201 || auVar204._8_4_ <= auVar48._8_4_) &&
                auVar204._12_4_ <= iVar201) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 4) = 0x3f800000;
            }
            auVar204 = (auVar136 | auVar75) ^ auVar106;
            auVar205._0_4_ = -(uint)(auVar48._0_4_ < auVar204._0_4_);
            auVar205._4_4_ = -(uint)(iVar8 < auVar204._4_4_);
            auVar205._8_4_ = -(uint)(auVar48._8_4_ < auVar204._8_4_);
            auVar205._12_4_ = -(uint)(iVar201 < auVar204._12_4_);
            iVar8 = -(uint)(auVar204._4_4_ == iVar8);
            iVar201 = -(uint)(auVar204._12_4_ == iVar201);
            auVar220._4_4_ = iVar8;
            auVar220._0_4_ = iVar8;
            auVar220._8_4_ = iVar201;
            auVar220._12_4_ = iVar201;
            auVar137._4_4_ = auVar205._4_4_;
            auVar137._0_4_ = auVar205._4_4_;
            auVar137._8_4_ = auVar205._12_4_;
            auVar137._12_4_ = auVar205._12_4_;
            auVar138._8_4_ = 0xffffffff;
            auVar138._0_8_ = 0xffffffffffffffff;
            auVar138._12_4_ = 0xffffffff;
            auVar138 = (auVar137 | auVar220 & auVar205) ^ auVar138;
            if ((auVar138 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 8) = 0x3f800000;
            }
            puVar20 = (uint *)(ulong)auVar138._8_2_;
            if ((auVar138 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar17 + uVar19 * 4 + 0xc) = 0x3f800000;
            }
            uVar19 = uVar19 + 4;
          } while ((uVar9 + 3 & 0xfffffffc) != uVar19);
        }
        if (0 < (int)uVar10) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          puVar20 = (uint *)0x0;
          do {
            if (0 < (int)uVar11) {
              pMVar29 = (Mat *)0x0;
              do {
                *(float *)((long)pvVar30 + (long)pMVar29 * 4) =
                     *(float *)((long)pvVar17 + (long)pMVar29 * 4) *
                     *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              } while (pMVar21 != pMVar29);
            }
            puVar20 = (uint *)((long)&((Mat *)puVar20)->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while ((Mat *)puVar20 != pMVar22);
        }
      }
    }
    else if (uVar11 == 1) {
      iVar8 = bottom_blob->w;
      puVar20 = (uint *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar8 < 1) {
LAB_001fb1a8:
        fVar34 = 1.0;
      }
      else {
        fVar34 = 1.0;
        lVar27 = 0;
        do {
          fVar34 = fVar34 * *(float *)((long)bottom_blob->data + lVar27 * 4);
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
      }
LAB_001fb1b5:
      *(float *)top_blob->data = fVar34;
    }
    break;
  case 7:
    post_process = (undefined1)this->keepdims;
    auVar110._0_8_ = lVar27 << 0x3f;
    auVar110._8_8_ = lVar24 << 0x3f;
    uVar13 = movmskpd(uVar11,auVar110);
    bVar15 = (byte)uVar13;
    fVar33 = 1.0;
LAB_001f8dda:
    iVar8 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                      (bottom_blob,top_blob,fVar33,(bool)(bVar15 >> 1),(bool)(bVar15 & 1),reduce_c,
                       (bool)post_process,0.0,(int)opt,in_stack_ffffffffffffff10);
    return iVar8;
  case 8:
    if (this->keepdims == 0) {
      auVar115._0_8_ = lVar27 << 0x3f;
      auVar115._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar115);
      iVar8 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    else {
      auVar112._0_8_ = lVar27 << 0x3f;
      auVar112._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar112);
      iVar8 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
    }
    if (iVar8 != 0) {
      return -100;
    }
    iVar8 = top_blob->dims;
    if (iVar8 != 3) {
      if (iVar8 == 2) {
        uVar11 = top_blob->h * top_blob->w;
        if (0 < (int)uVar11) {
          pvVar17 = top_blob->data;
          uVar19 = 0;
          do {
            *(float *)((long)pvVar17 + uVar19 * 4) = SQRT(*(float *)((long)pvVar17 + uVar19 * 4));
            uVar19 = uVar19 + 1;
          } while (uVar11 != uVar19);
          return 0;
        }
        return 0;
      }
      if (iVar8 != 1) {
        return 0;
      }
      iVar8 = top_blob->w;
      if (0 < (long)iVar8) {
        pvVar17 = top_blob->data;
        lVar27 = 0;
        do {
          *(float *)((long)pvVar17 + lVar27 * 4) = SQRT(*(float *)((long)pvVar17 + lVar27 * 4));
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
        return 0;
      }
      return 0;
    }
    uVar11 = top_blob->c;
    uVar10 = top_blob->h * top_blob->w;
    if ((ulong)uVar11 != 1) {
      if (0 < (int)uVar11) {
        pvVar17 = top_blob->data;
        sVar2 = top_blob->elemsize;
        sVar3 = top_blob->cstep;
        uVar19 = 0;
        do {
          if (0 < (int)uVar10) {
            uVar12 = 0;
            do {
              *(float *)((long)pvVar17 + uVar12 * 4) = SQRT(*(float *)((long)pvVar17 + uVar12 * 4));
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
          }
          uVar19 = uVar19 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
        } while (uVar19 != uVar11);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar10) {
      pvVar17 = top_blob->data;
      uVar19 = 0;
      do {
        *(float *)((long)pvVar17 + uVar19 * 4) = SQRT(*(float *)((long)pvVar17 + uVar19 * 4));
        uVar19 = uVar19 + 1;
      } while (uVar10 != uVar19);
      return 0;
    }
    return 0;
  case 9:
    if (this->keepdims == 0) {
      auVar113._0_8_ = lVar27 << 0x3f;
      auVar113._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar113);
      puVar20 = (uint *)top_blob;
      iVar8 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
      fVar33 = extraout_XMM0_Da_00;
    }
    else {
      auVar108._0_8_ = lVar27 << 0x3f;
      auVar108._8_8_ = lVar24 << 0x3f;
      uVar13 = movmskpd(uVar11,auVar108);
      puVar20 = (uint *)top_blob;
      iVar8 = reduction_op_keepdims<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                        (bottom_blob,top_blob,fVar33,(bool)((byte)uVar13 >> 1),
                         (bool)((byte)uVar13 & 1),reduce_c,opt);
      fVar33 = extraout_XMM0_Da;
    }
    if (iVar8 != 0) {
      return -100;
    }
    goto LAB_002007e9;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (uVar11 == 3) {
        uVar11 = bottom_blob->w;
        pMVar22 = (Mat *)(long)(int)uVar11;
        uVar10 = bottom_blob->h;
        pMVar29 = (Mat *)(ulong)uVar10;
        uVar9 = bottom_blob->c;
        pMVar21 = (Mat *)(ulong)uVar9;
        uVar26 = uVar10 * uVar11;
        auVar75._8_4_ = 0xffffffff;
        auVar75._0_8_ = 0xffffffffffffffff;
        auVar75._12_4_ = 0xffffffff;
        in_XMM0._0_8_ = SUB168(auVar75 ^ auVar106,0) << 0x3f;
        in_XMM0._8_8_ = SUB168(auVar75 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(3,in_XMM0);
        bVar28 = reduce_c ^ 1;
        if (iVar8 == 0 && bVar28 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          puVar20 = (uint *)(ulong)uVar9;
          Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
          pvVar17 = mins.data;
          iVar8 = -100;
          in_XMM0 = extraout_XMM0_10;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar9 < 1) {
              in_XMM0 = ZEXT816(0);
            }
            else {
              pvVar30 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar22 = (Mat *)0x0;
              do {
                if ((int)uVar26 < 1) {
                  fVar33 = 0.0;
                }
                else {
                  fVar33 = 0.0;
                  uVar19 = 0;
                  do {
                    fVar34 = expf(*(float *)((long)pvVar30 + uVar19 * 4));
                    fVar33 = fVar33 + fVar34;
                    uVar19 = uVar19 + 1;
                  } while (uVar26 != uVar19);
                }
                *(float *)((long)pvVar17 + (long)pMVar22 * 4) = fVar33;
                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                pvVar30 = (void *)((long)pvVar30 + sVar2 * sVar3);
              } while (pMVar22 != pMVar21);
              in_XMM0 = ZEXT816(0);
              pMVar22 = (Mat *)0x0;
              do {
                in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)pvVar17 + (long)pMVar22 * 4);
                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              } while (pMVar21 != pMVar22);
            }
            *(int *)top_blob->data = in_XMM0._0_4_;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feecd;
              (*(mins.allocator)->_vptr_Allocator[3])();
              in_XMM0 = extraout_XMM0_20;
            }
          }
          goto LAB_002007da;
        }
        if (iVar8 == 0 && reduce_c == false) {
          puVar20 = (uint *)pMVar21;
          Mat::create(top_blob,uVar9,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_14;
          if (0 < (int)uVar9) {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar17 = bottom_blob->data;
            pvVar30 = top_blob->data;
            pMVar22 = (Mat *)0x0;
            do {
              if ((int)uVar26 < 1) {
                in_XMM0 = ZEXT816(0);
              }
              else {
                in_XMM0 = ZEXT816(0);
                uVar19 = 0;
                do {
                  fVar33 = expf(*(float *)((long)pvVar17 + uVar19 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                  uVar19 = uVar19 + 1;
                } while (uVar26 != uVar19);
              }
              *(int *)((long)pvVar30 + (long)pMVar22 * 4) = in_XMM0._0_4_;
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
            } while (pMVar22 != pMVar21);
          }
        }
        else {
          pMVar16 = (Mat *)(ulong)uVar11;
          bVar25 = (byte)iVar8 >> 1 | bVar14;
          if (reduce_c != false || (bVar25 & 1) != 0) {
            if ((bVar25 & 1) == 0 && bVar28 == 0) {
              Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)0x1;
              Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
              sVar2 = mins.cstep;
              pvVar17 = mins.data;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) && (mins.cstep * (long)mins.c != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  memset(mins.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar9) {
                  local_58 = bottom_blob->data;
                  sVar3 = bottom_blob->elemsize;
                  lVar27 = CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize);
                  sVar5 = bottom_blob->cstep;
                  local_c0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar23 = (Mat *)0x0;
                      pvVar30 = local_58;
                      do {
                        if ((int)uVar11 < 1) {
                          fVar33 = 0.0;
                        }
                        else {
                          fVar33 = 0.0;
                          pMVar18 = (Mat *)0x0;
                          do {
                            fVar34 = expf(*(float *)((long)pvVar30 + (long)pMVar18 * 4));
                            fVar33 = fVar33 + fVar34;
                            pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                          } while (pMVar16 != pMVar18);
                        }
                        *(float *)((long)pvVar17 +
                                  (long)pMVar23 * 4 + lVar27 * sVar2 * (long)local_c0) = fVar33;
                        pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                        pvVar30 = (void *)((long)pvVar30 + (long)pMVar22 * 4);
                      } while (pMVar23 != pMVar29);
                    }
                    local_c0 = (Mat *)((long)&local_c0->data + 1);
                    local_58 = (void *)((long)local_58 + sVar3 * sVar5);
                  } while (local_c0 != pMVar21);
                }
                uVar11 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar11) {
                  memset(top_blob->data,0,(ulong)uVar11 << 2);
                }
                if (0 < (int)uVar9) {
                  pvVar30 = top_blob->data;
                  pMVar22 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar16 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar30 + (long)pMVar16 * 4) =
                             *(float *)((long)pvVar17 + (long)pMVar16 * 4) +
                             *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                        pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                      } while (pMVar29 != pMVar16);
                    }
                    pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                    pvVar17 = (void *)((long)pvVar17 +
                                      sVar2 * CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize
                                                      ));
                  } while (pMVar22 != pMVar21);
                }
                iVar8 = 0;
                puVar20 = (uint *)pMVar29;
              }
            }
            else {
              bVar25 = (byte)iVar8 | bVar15;
              if ((bVar25 & 1) != 0 || bVar28 != 0) {
                puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
                if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                  Mat::create(top_blob,uVar11,uVar10,sVar2,opt->blob_allocator);
                  uVar11 = top_blob->c * (int)top_blob->cstep;
                  puVar20 = (uint *)pMVar16;
                  in_XMM0 = extraout_XMM0_25;
                  if (0 < (int)uVar11) {
                    puVar20 = (uint *)0x0;
                    memset(top_blob->data,0,(ulong)uVar11 << 2);
                    in_XMM0 = extraout_XMM0_26;
                  }
                  if (0 < (int)uVar9) {
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar17 = bottom_blob->data;
                    pvVar30 = top_blob->data;
                    pMVar22 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar26) {
                        uVar19 = 0;
                        do {
                          fVar33 = expf(*(float *)((long)pvVar17 + uVar19 * 4));
                          in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar30 + uVar19 * 4);
                          in_XMM0._4_12_ = extraout_var_04;
                          *(float *)((long)pvVar30 + uVar19 * 4) = in_XMM0._0_4_;
                          uVar19 = uVar19 + 1;
                        } while (uVar26 != uVar19);
                      }
                      pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                      pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                    } while (pMVar22 != pMVar21);
                  }
                }
                else if (reduce_c == false && (bVar25 & 1) == 0) {
                  puVar20 = (uint *)(ulong)uVar11;
                  Mat::create(top_blob,uVar11,uVar9,sVar2,opt->blob_allocator);
                  uVar26 = top_blob->c * (int)top_blob->cstep;
                  in_XMM0 = extraout_XMM0_05;
                  if (0 < (int)uVar26) {
                    puVar20 = (uint *)0x0;
                    memset(top_blob->data,0,(ulong)uVar26 << 2);
                    in_XMM0 = extraout_XMM0_06;
                  }
                  if (0 < (int)uVar9) {
                    local_c8 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    pvVar17 = top_blob->data;
                    iVar8 = top_blob->w;
                    sVar3 = bottom_blob->cstep;
                    sVar5 = top_blob->elemsize;
                    local_e8 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        uVar9 = 0;
                        pvVar30 = local_c8;
                        do {
                          if (0 < (int)uVar11) {
                            pMVar22 = (Mat *)0x0;
                            do {
                              fVar33 = expf(*(float *)((long)pvVar30 + (long)pMVar22 * 4));
                              in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar17 + (long)pMVar22 * 4)
                              ;
                              in_XMM0._4_12_ = extraout_var_02;
                              *(float *)((long)pvVar17 + (long)pMVar22 * 4) = in_XMM0._0_4_;
                              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                            } while (pMVar16 != pMVar22);
                          }
                          uVar9 = uVar9 + 1;
                          pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar11 * 4);
                        } while (uVar9 != uVar10);
                      }
                      local_e8 = (Mat *)((long)&local_e8->data + 1);
                      local_c8 = (void *)((long)local_c8 + sVar2 * sVar3);
                      pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar5);
                    } while (local_e8 != pMVar21);
                  }
                }
                goto LAB_002007e4;
              }
              Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
              mins.cstep = 0;
              mins.data = (void *)0x0;
              mins.refcount._0_4_ = 0;
              mins.refcount._4_4_ = 0;
              mins.elemsize._0_4_ = 0;
              mins.elemsize._4_4_ = 0;
              mins.elempack = 0;
              mins.allocator = (Allocator *)0x0;
              mins.dims = 0;
              mins.w = 0;
              mins.h = 0;
              mins.d = 0;
              mins.c = 0;
              puVar20 = (uint *)pMVar22;
              Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
              sVar2 = mins.cstep;
              pvVar17 = mins.data;
              iVar8 = -100;
              if ((mins.data != (void *)0x0) &&
                 (puVar20 = (uint *)mins.cstep, mins.cstep * (long)mins.c != 0)) {
                uVar26 = (int)mins.cstep * mins.c;
                if (0 < (int)uVar26) {
                  memset(mins.data,0,(ulong)uVar26 << 2);
                }
                if (0 < (int)uVar9) {
                  local_c0 = (Mat *)bottom_blob->data;
                  sVar3 = bottom_blob->elemsize;
                  sVar5 = bottom_blob->cstep;
                  lVar27 = CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize);
                  local_e8 = (Mat *)0x0;
                  pvVar30 = pvVar17;
                  do {
                    if (0 < (int)uVar10) {
                      uVar26 = 0;
                      pMVar29 = local_c0;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar23 = (Mat *)0x0;
                          do {
                            fVar33 = expf(*(float *)((long)pMVar29 + (long)pMVar23 * 4));
                            *(float *)((long)pvVar30 + (long)pMVar23 * 4) =
                                 fVar33 + *(float *)((long)pvVar30 + (long)pMVar23 * 4);
                            pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                          } while (pMVar16 != pMVar23);
                        }
                        uVar26 = uVar26 + 1;
                        pMVar29 = (Mat *)((long)pMVar29 + (long)pMVar22 * 4);
                      } while (uVar26 != uVar10);
                    }
                    local_e8 = (Mat *)((long)&local_e8->data + 1);
                    local_c0 = (Mat *)((long)local_c0 + sVar3 * sVar5);
                    pvVar30 = (void *)((long)pvVar30 + lVar27 * sVar2);
                  } while (local_e8 != pMVar21);
                }
                uVar10 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar10) {
                  memset(top_blob->data,0,(ulong)uVar10 << 2);
                }
                if (0 < (int)uVar9) {
                  pvVar30 = top_blob->data;
                  pMVar22 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar29 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar30 + (long)pMVar29 * 4) =
                             *(float *)((long)pvVar17 + (long)pMVar29 * 4) +
                             *(float *)((long)pvVar30 + (long)pMVar29 * 4);
                        pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                      } while (pMVar16 != pMVar29);
                    }
                    pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                    pvVar17 = (void *)((long)pvVar17 +
                                      sVar2 * CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize
                                                      ));
                  } while (pMVar22 != pMVar21);
                }
                iVar8 = 0;
                puVar20 = (uint *)pMVar21;
              }
            }
            goto LAB_002007d0;
          }
          puVar20 = (uint *)(ulong)uVar10;
          Mat::create(top_blob,uVar10,uVar9,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_16;
          if (0 < (int)uVar9) {
            local_58 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            iVar8 = top_blob->w;
            sVar3 = top_blob->elemsize;
            sVar5 = bottom_blob->cstep;
            pvVar17 = top_blob->data;
            local_c0 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar23 = (Mat *)0x0;
                pvVar30 = local_58;
                do {
                  if ((int)uVar11 < 1) {
                    in_XMM0 = ZEXT816(0);
                  }
                  else {
                    in_XMM0 = ZEXT816(0);
                    pMVar18 = (Mat *)0x0;
                    do {
                      fVar33 = expf(*(float *)((long)pvVar30 + (long)pMVar18 * 4));
                      in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                      pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                    } while (pMVar16 != pMVar18);
                  }
                  *(int *)((long)pvVar17 + (long)pMVar23 * 4 + (long)iVar8 * sVar3 * (long)local_c0)
                       = in_XMM0._0_4_;
                  pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                  pvVar30 = (void *)((long)pvVar30 + (long)pMVar22 * 4);
                } while (pMVar23 != pMVar29);
              }
              local_c0 = (Mat *)((long)&local_c0->data + 1);
              local_58 = (void *)((long)local_58 + sVar2 * sVar5);
            } while (local_c0 != pMVar21);
          }
        }
      }
      else if (uVar11 == 2) {
        uVar11 = bottom_blob->w;
        pMVar21 = (Mat *)(ulong)uVar11;
        uVar10 = bottom_blob->h;
        pMVar22 = (Mat *)(ulong)uVar10;
        auVar68._8_4_ = 0xffffffff;
        auVar68._0_8_ = 0xffffffffffffffff;
        auVar68._12_4_ = 0xffffffff;
        in_XMM0._0_8_ = SUB168(auVar68 ^ auVar106,0) << 0x3f;
        in_XMM0._8_8_ = SUB168(auVar68 ^ auVar106,8) << 0x3f;
        iVar8 = movmskpd(uVar13,in_XMM0);
        if (iVar8 == 0) {
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          mins.cstep = 0;
          mins.data = (void *)0x0;
          mins.refcount._0_4_ = 0;
          mins.refcount._4_4_ = 0;
          mins.elemsize._0_4_ = 0;
          mins.elemsize._4_4_ = 0;
          mins.elempack = 0;
          mins.allocator = (Allocator *)0x0;
          mins.dims = 0;
          mins.w = 0;
          mins.h = 0;
          mins.d = 0;
          mins.c = 0;
          puVar20 = (uint *)pMVar22;
          Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
          pvVar17 = mins.data;
          iVar8 = -100;
          in_XMM0 = extraout_XMM0_09;
          if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
            if ((int)uVar10 < 1) {
              in_XMM0 = ZEXT816(0);
            }
            else {
              pvVar30 = bottom_blob->data;
              iVar8 = bottom_blob->w;
              sVar2 = bottom_blob->elemsize;
              pMVar29 = (Mat *)0x0;
              do {
                fVar33 = 0.0;
                if (0 < (int)uVar11) {
                  pMVar16 = (Mat *)0x0;
                  do {
                    fVar34 = expf(*(float *)((long)pvVar30 + (long)pMVar16 * 4));
                    fVar33 = fVar33 + fVar34;
                    pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                  } while (pMVar21 != pMVar16);
                }
                *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar33;
                pMVar29 = (Mat *)((long)&pMVar29->data + 1);
                pvVar30 = (void *)((long)pvVar30 + (long)iVar8 * sVar2);
              } while (pMVar29 != pMVar22);
              in_XMM0 = ZEXT816(0);
              pMVar21 = (Mat *)0x0;
              do {
                in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)pvVar17 + (long)pMVar21 * 4);
                pMVar21 = (Mat *)((long)&pMVar21->data + 1);
              } while (pMVar22 != pMVar21);
            }
            *(int *)top_blob->data = in_XMM0._0_4_;
            iVar8 = 0;
          }
          piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              puVar20 = (uint *)mins.data;
              if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feecd;
              (*(mins.allocator)->_vptr_Allocator[3])();
              in_XMM0 = extraout_XMM0_19;
            }
          }
          goto LAB_002007da;
        }
        if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
          puVar20 = (uint *)pMVar22;
          Mat::create(top_blob,uVar10,sVar2,opt->blob_allocator);
          in_XMM0 = extraout_XMM0_13;
          if (0 < (int)uVar10) {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            pMVar29 = (Mat *)0x0;
            do {
              in_XMM0 = ZEXT816(0);
              if (0 < (int)uVar11) {
                pMVar16 = (Mat *)0x0;
                do {
                  fVar33 = expf(*(float *)((long)pvVar17 + (long)pMVar16 * 4));
                  in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                } while (pMVar21 != pMVar16);
              }
              *(int *)((long)pvVar30 + (long)pMVar29 * 4) = in_XMM0._0_4_;
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while (pMVar29 != pMVar22);
          }
        }
        else if (((bVar15 | (byte)iVar8) & 1) == 0) {
          puVar20 = (uint *)pMVar21;
          Mat::create(top_blob,uVar11,sVar2,opt->blob_allocator);
          uVar9 = top_blob->c * (int)top_blob->cstep;
          in_XMM0 = extraout_XMM0_03;
          if (0 < (int)uVar9) {
            puVar20 = (uint *)0x0;
            memset(top_blob->data,0,(ulong)uVar9 << 2);
            in_XMM0 = extraout_XMM0_04;
          }
          if (0 < (int)uVar10) {
            pvVar17 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pvVar30 = top_blob->data;
            pMVar29 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar16 = (Mat *)0x0;
                do {
                  fVar33 = expf(*(float *)((long)pvVar17 + (long)pMVar16 * 4));
                  in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                  in_XMM0._4_12_ = extraout_var_01;
                  *(float *)((long)pvVar30 + (long)pMVar16 * 4) = in_XMM0._0_4_;
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                } while (pMVar21 != pMVar16);
              }
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
            } while (pMVar29 != pMVar22);
          }
        }
      }
      else if (uVar11 == 1) {
        iVar8 = bottom_blob->w;
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar8 < 1) goto LAB_001fb1c1;
        pvVar17 = bottom_blob->data;
        in_XMM0 = (undefined1  [16])0x0;
        lVar27 = 0;
        do {
          fVar33 = expf(*(float *)((long)pvVar17 + lVar27 * 4));
          in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
        goto LAB_001fb1c5;
      }
    }
    else if (uVar11 == 3) {
      uVar11 = bottom_blob->w;
      pMVar21 = (Mat *)(long)(int)uVar11;
      uVar10 = bottom_blob->h;
      pMVar22 = (Mat *)(ulong)uVar10;
      uVar9 = bottom_blob->c;
      pMVar29 = (Mat *)(ulong)uVar9;
      uVar26 = uVar10 * uVar11;
      auVar204._8_4_ = 0xffffffff;
      auVar204._0_8_ = 0xffffffffffffffff;
      auVar204._12_4_ = 0xffffffff;
      in_XMM0._0_8_ = SUB168(auVar204 ^ auVar106,0) << 0x3f;
      in_XMM0._8_8_ = SUB168(auVar204 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(3,in_XMM0);
      bVar28 = reduce_c ^ 1;
      if (iVar8 == 0 && bVar28 == 0) {
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar29;
        Mat::create(&mins,uVar9,sVar2,opt->workspace_allocator);
        pvVar17 = mins.data;
        iVar8 = -100;
        in_XMM0 = extraout_XMM0_08;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar9 < 1) {
            in_XMM0 = ZEXT816(0);
          }
          else {
            pvVar30 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pMVar22 = (Mat *)0x0;
            do {
              if ((int)uVar26 < 1) {
                fVar33 = 0.0;
              }
              else {
                fVar33 = 0.0;
                uVar19 = 0;
                do {
                  fVar34 = expf(*(float *)((long)pvVar30 + uVar19 * 4));
                  fVar33 = fVar33 + fVar34;
                  uVar19 = uVar19 + 1;
                } while (uVar26 != uVar19);
              }
              *(float *)((long)pvVar17 + (long)pMVar22 * 4) = fVar33;
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pvVar30 = (void *)((long)pvVar30 + sVar2 * sVar3);
            } while (pMVar22 != pMVar29);
            in_XMM0 = ZEXT816(0);
            pMVar22 = (Mat *)0x0;
            do {
              in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)pvVar17 + (long)pMVar22 * 4);
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
            } while (pMVar29 != pMVar22);
          }
          *(int *)top_blob->data = in_XMM0._0_4_;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) {
joined_r0x001feecd:
              mins.data = puVar20;
              if ((Mat *)puVar20 != (Mat *)0x0) {
                free(puVar20);
                in_XMM0 = extraout_XMM0_21;
              }
            }
            else {
              (*(mins.allocator)->_vptr_Allocator[3])();
              in_XMM0 = extraout_XMM0_18;
            }
          }
        }
LAB_002007da:
        if (iVar8 != 0) {
          return -100;
        }
      }
      else if (iVar8 == 0 && reduce_c == false) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,1,uVar9,sVar2,opt->blob_allocator);
        in_XMM0 = extraout_XMM0_12;
        if (0 < (int)uVar9) {
          pvVar17 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          sVar3 = top_blob->elemsize;
          sVar5 = top_blob->cstep;
          sVar4 = bottom_blob->cstep;
          pMVar22 = (Mat *)0x0;
          do {
            if ((int)uVar26 < 1) {
              in_XMM0 = ZEXT816(0);
            }
            else {
              in_XMM0 = ZEXT816(0);
              uVar19 = 0;
              do {
                fVar33 = expf(*(float *)((long)pvVar17 + uVar19 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                uVar19 = uVar19 + 1;
              } while (uVar26 != uVar19);
            }
            *(int *)((long)pvVar30 + sVar3 * sVar5 * (long)pMVar22) = in_XMM0._0_4_;
            pMVar22 = (Mat *)((long)&pMVar22->data + 1);
            pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar4);
          } while (pMVar22 != pMVar29);
        }
      }
      else {
        pMVar16 = (Mat *)(ulong)uVar11;
        bVar25 = (byte)iVar8 >> 1 | bVar14;
        if (reduce_c != false || (bVar25 & 1) != 0) {
          if ((bVar25 & 1) == 0 && bVar28 == 0) {
            Mat::create(top_blob,1,uVar10,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)0x1;
            Mat::create(&mins,1,uVar10,uVar9,sVar2,opt->workspace_allocator);
            sVar2 = mins.cstep;
            pvVar17 = mins.data;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) && (mins.cstep * (long)mins.c != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                memset(mins.data,0,(ulong)uVar26 << 2);
              }
              if (0 < (int)uVar9) {
                local_58 = bottom_blob->data;
                sVar3 = bottom_blob->elemsize;
                lVar27 = CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize);
                sVar5 = bottom_blob->cstep;
                local_c0 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    pMVar23 = (Mat *)0x0;
                    pvVar30 = local_58;
                    do {
                      if ((int)uVar11 < 1) {
                        fVar33 = 0.0;
                      }
                      else {
                        fVar33 = 0.0;
                        pMVar18 = (Mat *)0x0;
                        do {
                          fVar34 = expf(*(float *)((long)pvVar30 + (long)pMVar18 * 4));
                          fVar33 = fVar33 + fVar34;
                          pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                        } while (pMVar16 != pMVar18);
                      }
                      *(float *)((long)pvVar17 + (long)pMVar23 * 4 + lVar27 * sVar2 * (long)local_c0
                                ) = fVar33;
                      pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                      pvVar30 = (void *)((long)pvVar30 + (long)pMVar21 * 4);
                    } while (pMVar23 != pMVar22);
                  }
                  local_c0 = (Mat *)((long)&local_c0->data + 1);
                  local_58 = (void *)((long)local_58 + sVar3 * sVar5);
                } while (local_c0 != pMVar29);
              }
              uVar11 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar11) {
                memset(top_blob->data,0,(ulong)uVar11 << 2);
              }
              if (0 < (int)uVar9) {
                pvVar30 = top_blob->data;
                pMVar21 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    pMVar16 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar30 + (long)pMVar16 * 4) =
                           *(float *)((long)pvVar17 + (long)pMVar16 * 4) +
                           *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                      pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                    } while (pMVar22 != pMVar16);
                  }
                  pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                  pvVar17 = (void *)((long)pvVar17 +
                                    sVar2 * CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize))
                  ;
                } while (pMVar21 != pMVar29);
              }
              iVar8 = 0;
              puVar20 = (uint *)pMVar22;
            }
          }
          else {
            bVar25 = (byte)iVar8 | bVar15;
            if ((bVar25 & 1) != 0 || bVar28 != 0) {
              puVar20 = (uint *)(ulong)CONCAT31(uVar6,bVar14 | bVar15 | bVar28);
              if (((bVar14 | bVar15) & 1) == 0 && bVar28 == 0) {
                Mat::create(top_blob,uVar11,uVar10,1,sVar2,opt->blob_allocator);
                uVar11 = top_blob->c * (int)top_blob->cstep;
                puVar20 = (uint *)pMVar16;
                in_XMM0 = extraout_XMM0_23;
                if (0 < (int)uVar11) {
                  puVar20 = (uint *)0x0;
                  memset(top_blob->data,0,(ulong)uVar11 << 2);
                  in_XMM0 = extraout_XMM0_24;
                }
                if (0 < (int)uVar9) {
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  pvVar17 = bottom_blob->data;
                  pvVar30 = top_blob->data;
                  pMVar22 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar26) {
                      uVar19 = 0;
                      do {
                        fVar33 = expf(*(float *)((long)pvVar17 + uVar19 * 4));
                        in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar30 + uVar19 * 4);
                        in_XMM0._4_12_ = extraout_var_03;
                        *(float *)((long)pvVar30 + uVar19 * 4) = in_XMM0._0_4_;
                        uVar19 = uVar19 + 1;
                      } while (uVar26 != uVar19);
                    }
                    pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                  } while (pMVar22 != pMVar29);
                }
              }
              else if (reduce_c == false && (bVar25 & 1) == 0) {
                puVar20 = (uint *)(ulong)uVar11;
                Mat::create(top_blob,uVar11,1,uVar9,sVar2,opt->blob_allocator);
                sVar2 = top_blob->cstep;
                uVar26 = top_blob->c * (int)sVar2;
                in_XMM0 = extraout_XMM0_01;
                if (0 < (int)uVar26) {
                  puVar20 = (uint *)0x0;
                  memset(top_blob->data,0,(ulong)uVar26 << 2);
                  in_XMM0 = extraout_XMM0_02;
                }
                if (0 < (int)uVar9) {
                  local_c8 = bottom_blob->data;
                  pvVar17 = top_blob->data;
                  pMVar22 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  sVar3 = top_blob->elemsize;
                  local_e8 = (Mat *)0x0;
                  puVar20 = (uint *)pMVar22;
                  do {
                    if (0 < (int)uVar10) {
                      uVar9 = 0;
                      pvVar30 = local_c8;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar21 = (Mat *)0x0;
                          do {
                            fVar33 = expf(*(float *)((long)pvVar30 + (long)pMVar21 * 4));
                            in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar17 + (long)pMVar21 * 4);
                            in_XMM0._4_12_ = extraout_var_00;
                            *(float *)((long)pvVar17 + (long)pMVar21 * 4) = in_XMM0._0_4_;
                            pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                          } while (pMVar16 != pMVar21);
                        }
                        uVar9 = uVar9 + 1;
                        pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar11 * 4);
                      } while (uVar9 != uVar10);
                    }
                    local_e8 = (Mat *)((long)&local_e8->data + 1);
                    local_c8 = (void *)((long)&pMVar22->data + (long)local_c8);
                    pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
                  } while (local_e8 != pMVar29);
                }
              }
              goto LAB_002007e4;
            }
            Mat::create(top_blob,uVar11,1,1,sVar2,opt->blob_allocator);
            mins.cstep = 0;
            mins.data = (void *)0x0;
            mins.refcount._0_4_ = 0;
            mins.refcount._4_4_ = 0;
            mins.elemsize._0_4_ = 0;
            mins.elemsize._4_4_ = 0;
            mins.elempack = 0;
            mins.allocator = (Allocator *)0x0;
            mins.dims = 0;
            mins.w = 0;
            mins.h = 0;
            mins.d = 0;
            mins.c = 0;
            puVar20 = (uint *)pMVar21;
            Mat::create(&mins,uVar11,1,uVar9,sVar2,opt->workspace_allocator);
            sVar2 = mins.cstep;
            pvVar17 = mins.data;
            iVar8 = -100;
            if ((mins.data != (void *)0x0) && (mins.cstep * (long)mins.c != 0)) {
              uVar26 = (int)mins.cstep * mins.c;
              if (0 < (int)uVar26) {
                puVar20 = (uint *)0x0;
                memset(mins.data,0,(ulong)uVar26 << 2);
              }
              if (0 < (int)uVar9) {
                local_c0 = (Mat *)bottom_blob->data;
                sVar3 = bottom_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                lVar27 = CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize);
                local_e8 = (Mat *)0x0;
                pvVar30 = pvVar17;
                do {
                  if (0 < (int)uVar10) {
                    uVar26 = 0;
                    pMVar22 = local_c0;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar23 = (Mat *)0x0;
                        do {
                          fVar33 = expf(*(float *)((long)pMVar22 + (long)pMVar23 * 4));
                          *(float *)((long)pvVar30 + (long)pMVar23 * 4) =
                               fVar33 + *(float *)((long)pvVar30 + (long)pMVar23 * 4);
                          pMVar23 = (Mat *)((long)&pMVar23->data + 1);
                        } while (pMVar16 != pMVar23);
                      }
                      uVar26 = uVar26 + 1;
                      pMVar22 = (Mat *)((long)pMVar22 + (long)pMVar21 * 4);
                    } while (uVar26 != uVar10);
                  }
                  local_e8 = (Mat *)((long)&local_e8->data + 1);
                  local_c0 = (Mat *)((long)local_c0 + sVar3 * sVar5);
                  pvVar30 = (void *)((long)pvVar30 + lVar27 * sVar2);
                } while (local_e8 != pMVar29);
              }
              uVar10 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar10) {
                puVar20 = (uint *)0x0;
                memset(top_blob->data,0,(ulong)uVar10 << 2);
              }
              if (0 < (int)uVar9) {
                pvVar30 = top_blob->data;
                pMVar22 = (Mat *)0x0;
                puVar20 = (uint *)pvVar17;
                do {
                  if (0 < (int)uVar11) {
                    pMVar21 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar30 + (long)pMVar21 * 4) =
                           *(float *)((long)&((Mat *)puVar20)->data + (long)pMVar21 * 4) +
                           *(float *)((long)pvVar30 + (long)pMVar21 * 4);
                      pMVar21 = (Mat *)((long)&pMVar21->data + 1);
                    } while (pMVar16 != pMVar21);
                  }
                  pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                  puVar20 = (uint *)((long)&((Mat *)puVar20)->data +
                                    sVar2 * CONCAT44(mins.elemsize._4_4_,(undefined4)mins.elemsize))
                  ;
                } while (pMVar22 != pMVar29);
              }
              iVar8 = 0;
            }
          }
LAB_002007d0:
          Mat::~Mat(&mins);
          in_XMM0 = extraout_XMM0_22;
          goto LAB_002007da;
        }
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,uVar9,sVar2,opt->blob_allocator);
        in_XMM0 = extraout_XMM0_15;
        if (0 < (int)uVar9) {
          local_58 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          pMVar23 = (Mat *)(top_blob->elemsize * top_blob->cstep);
          sVar3 = bottom_blob->cstep;
          pvVar17 = top_blob->data;
          local_c0 = (Mat *)0x0;
          puVar20 = (uint *)pMVar23;
          do {
            if (0 < (int)uVar10) {
              pMVar18 = (Mat *)0x0;
              pvVar30 = local_58;
              do {
                if ((int)uVar11 < 1) {
                  in_XMM0 = ZEXT816(0);
                }
                else {
                  in_XMM0 = ZEXT816(0);
                  pMVar32 = (Mat *)0x0;
                  do {
                    fVar33 = expf(*(float *)((long)pvVar30 + (long)pMVar32 * 4));
                    in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                    pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                  } while (pMVar16 != pMVar32);
                }
                *(int *)((long)pvVar17 + (long)pMVar18 * 4 + (long)pMVar23 * (long)local_c0) =
                     in_XMM0._0_4_;
                pMVar18 = (Mat *)((long)&pMVar18->data + 1);
                pvVar30 = (void *)((long)pvVar30 + (long)pMVar21 * 4);
              } while (pMVar18 != pMVar22);
            }
            local_c0 = (Mat *)((long)&local_c0->data + 1);
            local_58 = (void *)((long)local_58 + sVar2 * sVar3);
          } while (local_c0 != pMVar29);
        }
      }
    }
    else if (uVar11 == 2) {
      uVar11 = bottom_blob->w;
      pMVar21 = (Mat *)(ulong)uVar11;
      uVar10 = bottom_blob->h;
      pMVar22 = (Mat *)(ulong)uVar10;
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      in_XMM0._0_8_ = SUB168(auVar49 ^ auVar106,0) << 0x3f;
      in_XMM0._8_8_ = SUB168(auVar49 ^ auVar106,8) << 0x3f;
      iVar8 = movmskpd(uVar13,in_XMM0);
      if (iVar8 == 0) {
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        mins.cstep = 0;
        mins.data = (void *)0x0;
        mins.refcount._0_4_ = 0;
        mins.refcount._4_4_ = 0;
        mins.elemsize._0_4_ = 0;
        mins.elemsize._4_4_ = 0;
        mins.elempack = 0;
        mins.allocator = (Allocator *)0x0;
        mins.dims = 0;
        mins.w = 0;
        mins.h = 0;
        mins.d = 0;
        mins.c = 0;
        puVar20 = (uint *)pMVar22;
        Mat::create(&mins,uVar10,sVar2,opt->workspace_allocator);
        pvVar17 = mins.data;
        iVar8 = -100;
        in_XMM0 = extraout_XMM0_07;
        if ((mins.data != (void *)0x0) && ((long)mins.c * mins.cstep != 0)) {
          if ((int)uVar10 < 1) {
            in_XMM0 = ZEXT816(0);
          }
          else {
            pvVar30 = bottom_blob->data;
            iVar8 = bottom_blob->w;
            sVar2 = bottom_blob->elemsize;
            pMVar29 = (Mat *)0x0;
            do {
              fVar33 = 0.0;
              if (0 < (int)uVar11) {
                pMVar16 = (Mat *)0x0;
                do {
                  fVar34 = expf(*(float *)((long)pvVar30 + (long)pMVar16 * 4));
                  fVar33 = fVar33 + fVar34;
                  pMVar16 = (Mat *)((long)&pMVar16->data + 1);
                } while (pMVar21 != pMVar16);
              }
              *(float *)((long)pvVar17 + (long)pMVar29 * 4) = fVar33;
              pMVar29 = (Mat *)((long)&pMVar29->data + 1);
              pvVar30 = (void *)((long)pvVar30 + (long)iVar8 * sVar2);
            } while (pMVar29 != pMVar22);
            in_XMM0 = ZEXT816(0);
            pMVar21 = (Mat *)0x0;
            do {
              in_XMM0._0_4_ = in_XMM0._0_4_ + *(float *)((long)pvVar17 + (long)pMVar21 * 4);
              pMVar21 = (Mat *)((long)&pMVar21->data + 1);
            } while (pMVar22 != pMVar21);
          }
          *(int *)top_blob->data = in_XMM0._0_4_;
          iVar8 = 0;
        }
        piVar7 = (int *)CONCAT44(mins.refcount._4_4_,mins.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            puVar20 = (uint *)mins.data;
            if (mins.allocator == (Allocator *)0x0) goto joined_r0x001feecd;
            (*(mins.allocator)->_vptr_Allocator[3])();
            in_XMM0 = extraout_XMM0_17;
          }
        }
        goto LAB_002007da;
      }
      if (((bVar14 | (byte)iVar8 >> 1) & 1) == 0) {
        puVar20 = (uint *)0x1;
        Mat::create(top_blob,1,uVar10,sVar2,opt->blob_allocator);
        in_XMM0 = extraout_XMM0_11;
        if (0 < (int)uVar10) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          pMVar29 = (Mat *)0x0;
          do {
            in_XMM0 = ZEXT816(0);
            if (0 < (int)uVar11) {
              pMVar16 = (Mat *)0x0;
              do {
                fVar33 = expf(*(float *)((long)pvVar17 + (long)pMVar16 * 4));
                in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              } while (pMVar21 != pMVar16);
            }
            *(int *)((long)pvVar30 + (long)pMVar29 * 4) = in_XMM0._0_4_;
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while (pMVar29 != pMVar22);
        }
      }
      else if (((bVar15 | (byte)iVar8) & 1) == 0) {
        puVar20 = (uint *)pMVar21;
        Mat::create(top_blob,uVar11,1,sVar2,opt->blob_allocator);
        uVar9 = top_blob->c * (int)top_blob->cstep;
        in_XMM0 = extraout_XMM0;
        if (0 < (int)uVar9) {
          puVar20 = (uint *)0x0;
          memset(top_blob->data,0,(ulong)uVar9 << 2);
          in_XMM0 = extraout_XMM0_00;
        }
        if (0 < (int)uVar10) {
          pvVar17 = bottom_blob->data;
          iVar8 = bottom_blob->w;
          sVar2 = bottom_blob->elemsize;
          pvVar30 = top_blob->data;
          pMVar29 = (Mat *)0x0;
          do {
            if (0 < (int)uVar11) {
              pMVar16 = (Mat *)0x0;
              do {
                fVar33 = expf(*(float *)((long)pvVar17 + (long)pMVar16 * 4));
                in_XMM0._0_4_ = fVar33 + *(float *)((long)pvVar30 + (long)pMVar16 * 4);
                in_XMM0._4_12_ = extraout_var;
                *(float *)((long)pvVar30 + (long)pMVar16 * 4) = in_XMM0._0_4_;
                pMVar16 = (Mat *)((long)&pMVar16->data + 1);
              } while (pMVar21 != pMVar16);
            }
            pMVar29 = (Mat *)((long)&pMVar29->data + 1);
            pvVar17 = (void *)((long)pvVar17 + (long)iVar8 * sVar2);
          } while (pMVar29 != pMVar22);
        }
      }
    }
    else if (uVar11 == 1) {
      iVar8 = bottom_blob->w;
      puVar20 = (uint *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      if ((long)iVar8 < 1) {
LAB_001fb1c1:
        in_XMM0 = (undefined1  [16])0x0;
      }
      else {
        pvVar17 = bottom_blob->data;
        in_XMM0 = (undefined1  [16])0x0;
        lVar27 = 0;
        do {
          fVar33 = expf(*(float *)((long)pvVar17 + lVar27 * 4));
          in_XMM0 = ZEXT416((uint)(in_XMM0._0_4_ + fVar33));
          lVar27 = lVar27 + 1;
        } while (iVar8 != lVar27);
      }
LAB_001fb1c5:
      *(int *)top_blob->data = in_XMM0._0_4_;
    }
LAB_002007e4:
    fVar33 = in_XMM0._0_4_;
LAB_002007e9:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,fVar33,(Option *)puVar20);
  default:
    goto switchD_001f8c1c_default;
  }
  if (1.1920929e-07 < ABS(fVar33 + -1.0)) {
LAB_002005d6:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar33,(Option *)puVar20);
  }
switchD_001f8c1c_default:
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}